

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  undefined4 uVar13;
  __int_type_conflict _Var14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  uint uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  int iVar63;
  undefined1 auVar64 [32];
  byte bVar65;
  ulong uVar66;
  uint uVar67;
  uint uVar68;
  long lVar69;
  long lVar70;
  Geometry *pGVar71;
  long lVar72;
  uint uVar73;
  byte bVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  float fVar78;
  float fVar79;
  float fVar134;
  float fVar136;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar85 [16];
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar86 [16];
  float fVar140;
  float fVar141;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined4 uVar153;
  undefined8 uVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar164;
  undefined1 auVar163 [32];
  float fVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  float fVar188;
  float fVar190;
  float fVar191;
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5f0 [16];
  Primitive *local_5e0;
  ulong local_5d8;
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [16];
  Geometry *local_548;
  Precalculations *local_540;
  ulong local_538;
  LinearSpace3fa *local_530;
  ulong local_528;
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  int local_450;
  int iStack_44c;
  int iStack_448;
  int iStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar66 = (ulong)(byte)prim[1];
  lVar72 = uVar66 * 0x25;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar66 * 4 + 6);
  auVar101 = vpmovsxbd_avx2(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar66 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar80);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar66 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar82);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar66 * 0xf + 6);
  auVar103 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar102 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar66 * 0x11 + 6);
  auVar99 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar66 * 0x1a + 6);
  auVar100 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar66 * 0x1b + 6);
  auVar93 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar66 * 0x1c + 6);
  auVar94 = vpmovsxbd_avx2(auVar11);
  uVar153 = *(undefined4 *)(prim + lVar72 + 0x12);
  auVar83._4_4_ = uVar153;
  auVar83._0_4_ = uVar153;
  auVar83._8_4_ = uVar153;
  auVar83._12_4_ = uVar153;
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar80 = vsubps_avx512vl(auVar81,*(undefined1 (*) [16])(prim + lVar72 + 6));
  fVar158 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar72 + 0x16)) *
            *(float *)(prim + lVar72 + 0x1a);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 7 + 6));
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0xb + 6));
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 9 + 6));
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0xd + 6));
  auVar87 = vpbroadcastd_avx512vl();
  auVar81 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar81 = vinsertps_avx512f(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar80 = vmulps_avx512vl(auVar83,auVar80);
  auVar81 = vmulps_avx512vl(auVar83,auVar81);
  auVar88 = vcvtdq2ps_avx512vl(auVar101);
  auVar89 = vcvtdq2ps_avx512vl(auVar98);
  auVar90 = vcvtdq2ps_avx512vl(auVar104);
  auVar91 = vcvtdq2ps_avx512vl(auVar103);
  auVar92 = vcvtdq2ps_avx512vl(auVar102);
  auVar101 = vcvtdq2ps_avx(auVar99);
  auVar104 = vcvtdq2ps_avx(auVar100);
  auVar103 = vcvtdq2ps_avx(auVar93);
  auVar102 = vcvtdq2ps_avx(auVar94);
  uVar153 = auVar81._0_4_;
  auVar174._4_4_ = uVar153;
  auVar174._0_4_ = uVar153;
  auVar174._8_4_ = uVar153;
  auVar174._12_4_ = uVar153;
  auVar174._16_4_ = uVar153;
  auVar174._20_4_ = uVar153;
  auVar174._24_4_ = uVar153;
  auVar174._28_4_ = uVar153;
  auVar93 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar94 = vpermps_avx512vl(auVar93,ZEXT1632(auVar81));
  auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar201 = ZEXT3264(auVar95);
  auVar96 = vpermps_avx512vl(auVar95,ZEXT1632(auVar81));
  auVar97 = vmulps_avx512vl(auVar96,auVar90);
  auVar99._4_4_ = auVar96._4_4_ * auVar101._4_4_;
  auVar99._0_4_ = auVar96._0_4_ * auVar101._0_4_;
  auVar99._8_4_ = auVar96._8_4_ * auVar101._8_4_;
  auVar99._12_4_ = auVar96._12_4_ * auVar101._12_4_;
  auVar99._16_4_ = auVar96._16_4_ * auVar101._16_4_;
  auVar99._20_4_ = auVar96._20_4_ * auVar101._20_4_;
  auVar99._24_4_ = auVar96._24_4_ * auVar101._24_4_;
  auVar99._28_4_ = auVar98._28_4_;
  auVar100._4_4_ = auVar102._4_4_ * auVar96._4_4_;
  auVar100._0_4_ = auVar102._0_4_ * auVar96._0_4_;
  auVar100._8_4_ = auVar102._8_4_ * auVar96._8_4_;
  auVar100._12_4_ = auVar102._12_4_ * auVar96._12_4_;
  auVar100._16_4_ = auVar102._16_4_ * auVar96._16_4_;
  auVar100._20_4_ = auVar102._20_4_ * auVar96._20_4_;
  auVar100._24_4_ = auVar102._24_4_ * auVar96._24_4_;
  auVar100._28_4_ = auVar96._28_4_;
  auVar98 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar89);
  auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar92);
  auVar81 = vfmadd231ps_fma(auVar100,auVar103,auVar94);
  auVar98 = vfmadd231ps_avx512vl(auVar98,auVar174,auVar88);
  auVar99 = vfmadd231ps_avx512vl(auVar99,auVar174,auVar91);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar104,auVar174);
  auVar100 = vbroadcastss_avx512vl(auVar80);
  auVar93 = vpermps_avx512vl(auVar93,ZEXT1632(auVar80));
  auVar94 = vpermps_avx512vl(auVar95,ZEXT1632(auVar80));
  auVar90 = vmulps_avx512vl(auVar94,auVar90);
  auVar101 = vmulps_avx512vl(auVar94,auVar101);
  auVar102 = vmulps_avx512vl(auVar94,auVar102);
  auVar94 = vfmadd231ps_avx512vl(auVar90,auVar93,auVar89);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,auVar92);
  auVar103 = vfmadd231ps_avx512vl(auVar102,auVar93,auVar103);
  auVar102 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar88);
  auVar88 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar91);
  auVar83 = vfmadd231ps_fma(auVar103,auVar100,auVar104);
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95._16_4_ = 0x7fffffff;
  auVar95._20_4_ = 0x7fffffff;
  auVar95._24_4_ = 0x7fffffff;
  auVar95._28_4_ = 0x7fffffff;
  auVar101 = vandps_avx(auVar95,auVar98);
  auVar92._8_4_ = 0x219392ef;
  auVar92._0_8_ = 0x219392ef219392ef;
  auVar92._12_4_ = 0x219392ef;
  auVar92._16_4_ = 0x219392ef;
  auVar92._20_4_ = 0x219392ef;
  auVar92._24_4_ = 0x219392ef;
  auVar92._28_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar101,auVar92,1);
  bVar17 = (bool)((byte)uVar76 & 1);
  auVar89._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar98._0_4_;
  bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar98._4_4_;
  bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar98._8_4_;
  bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar98._12_4_;
  bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
  auVar89._16_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar98._16_4_;
  bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
  auVar89._20_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar98._20_4_;
  bVar17 = (bool)((byte)(uVar76 >> 6) & 1);
  auVar89._24_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar98._24_4_;
  bVar17 = SUB81(uVar76 >> 7,0);
  auVar89._28_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar98._28_4_;
  auVar101 = vandps_avx(auVar95,auVar99);
  uVar76 = vcmpps_avx512vl(auVar101,auVar92,1);
  bVar17 = (bool)((byte)uVar76 & 1);
  auVar90._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar99._0_4_;
  bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar99._4_4_;
  bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar99._8_4_;
  bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar99._12_4_;
  bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
  auVar90._16_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar99._16_4_;
  bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
  auVar90._20_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar99._20_4_;
  bVar17 = (bool)((byte)(uVar76 >> 6) & 1);
  auVar90._24_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar99._24_4_;
  bVar17 = SUB81(uVar76 >> 7,0);
  auVar90._28_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar99._28_4_;
  auVar101 = vandps_avx(auVar95,ZEXT1632(auVar81));
  uVar76 = vcmpps_avx512vl(auVar101,auVar92,1);
  bVar17 = (bool)((byte)uVar76 & 1);
  auVar101._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._0_4_;
  bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._4_4_;
  bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._8_4_;
  bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar104 = vrcp14ps_avx512vl(auVar89);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar202 = ZEXT3264(auVar103);
  auVar98 = vfnmadd213ps_avx512vl(auVar89,auVar104,auVar103);
  auVar81 = vfmadd132ps_fma(auVar98,auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar90);
  auVar98 = vfnmadd213ps_avx512vl(auVar90,auVar104,auVar103);
  auVar80 = vfmadd132ps_fma(auVar98,auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar101);
  auVar101 = vfnmadd213ps_avx512vl(auVar101,auVar104,auVar103);
  auVar82 = vfmadd132ps_fma(auVar101,auVar104,auVar104);
  auVar91._4_4_ = fVar158;
  auVar91._0_4_ = fVar158;
  auVar91._8_4_ = fVar158;
  auVar91._12_4_ = fVar158;
  auVar91._16_4_ = fVar158;
  auVar91._20_4_ = fVar158;
  auVar91._24_4_ = fVar158;
  auVar91._28_4_ = fVar158;
  auVar101 = vcvtdq2ps_avx(auVar105);
  auVar104 = vcvtdq2ps_avx(auVar106);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar6 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vcvtdq2ps_avx(auVar107);
  auVar104 = vcvtdq2ps_avx(auVar108);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar7 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x12 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x16 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x14 + 6));
  auVar8 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vcvtdq2ps_avx(auVar103);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x18 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar9 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x1d + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x21 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar10 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x1f + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x23 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar11 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vsubps_avx(ZEXT1632(auVar6),auVar102);
  auVar93._4_4_ = auVar81._4_4_ * auVar101._4_4_;
  auVar93._0_4_ = auVar81._0_4_ * auVar101._0_4_;
  auVar93._8_4_ = auVar81._8_4_ * auVar101._8_4_;
  auVar93._12_4_ = auVar81._12_4_ * auVar101._12_4_;
  auVar93._16_4_ = auVar101._16_4_ * 0.0;
  auVar93._20_4_ = auVar101._20_4_ * 0.0;
  auVar93._24_4_ = auVar101._24_4_ * 0.0;
  auVar93._28_4_ = auVar101._28_4_;
  auVar101 = vsubps_avx(ZEXT1632(auVar7),auVar102);
  auVar108._0_4_ = auVar81._0_4_ * auVar101._0_4_;
  auVar108._4_4_ = auVar81._4_4_ * auVar101._4_4_;
  auVar108._8_4_ = auVar81._8_4_ * auVar101._8_4_;
  auVar108._12_4_ = auVar81._12_4_ * auVar101._12_4_;
  auVar108._16_4_ = auVar101._16_4_ * 0.0;
  auVar108._20_4_ = auVar101._20_4_ * 0.0;
  auVar108._24_4_ = auVar101._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar101 = vsubps_avx(ZEXT1632(auVar8),auVar88);
  auVar94._4_4_ = auVar80._4_4_ * auVar101._4_4_;
  auVar94._0_4_ = auVar80._0_4_ * auVar101._0_4_;
  auVar94._8_4_ = auVar80._8_4_ * auVar101._8_4_;
  auVar94._12_4_ = auVar80._12_4_ * auVar101._12_4_;
  auVar94._16_4_ = auVar101._16_4_ * 0.0;
  auVar94._20_4_ = auVar101._20_4_ * 0.0;
  auVar94._24_4_ = auVar101._24_4_ * 0.0;
  auVar94._28_4_ = auVar101._28_4_;
  auVar101 = vsubps_avx(ZEXT1632(auVar9),auVar88);
  auVar107._0_4_ = auVar80._0_4_ * auVar101._0_4_;
  auVar107._4_4_ = auVar80._4_4_ * auVar101._4_4_;
  auVar107._8_4_ = auVar80._8_4_ * auVar101._8_4_;
  auVar107._12_4_ = auVar80._12_4_ * auVar101._12_4_;
  auVar107._16_4_ = auVar101._16_4_ * 0.0;
  auVar107._20_4_ = auVar101._20_4_ * 0.0;
  auVar107._24_4_ = auVar101._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar101 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar83));
  auVar105._4_4_ = auVar82._4_4_ * auVar101._4_4_;
  auVar105._0_4_ = auVar82._0_4_ * auVar101._0_4_;
  auVar105._8_4_ = auVar82._8_4_ * auVar101._8_4_;
  auVar105._12_4_ = auVar82._12_4_ * auVar101._12_4_;
  auVar105._16_4_ = auVar101._16_4_ * 0.0;
  auVar105._20_4_ = auVar101._20_4_ * 0.0;
  auVar105._24_4_ = auVar101._24_4_ * 0.0;
  auVar105._28_4_ = auVar101._28_4_;
  auVar101 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar83));
  auVar106._0_4_ = auVar82._0_4_ * auVar101._0_4_;
  auVar106._4_4_ = auVar82._4_4_ * auVar101._4_4_;
  auVar106._8_4_ = auVar82._8_4_ * auVar101._8_4_;
  auVar106._12_4_ = auVar82._12_4_ * auVar101._12_4_;
  auVar106._16_4_ = auVar101._16_4_ * 0.0;
  auVar106._20_4_ = auVar101._20_4_ * 0.0;
  auVar106._24_4_ = auVar101._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar101 = vpminsd_avx2(auVar93,auVar108);
  auVar104 = vpminsd_avx2(auVar94,auVar107);
  auVar101 = vmaxps_avx(auVar101,auVar104);
  auVar104 = vpminsd_avx2(auVar105,auVar106);
  uVar153 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar103._4_4_ = uVar153;
  auVar103._0_4_ = uVar153;
  auVar103._8_4_ = uVar153;
  auVar103._12_4_ = uVar153;
  auVar103._16_4_ = uVar153;
  auVar103._20_4_ = uVar153;
  auVar103._24_4_ = uVar153;
  auVar103._28_4_ = uVar153;
  auVar104 = vmaxps_avx512vl(auVar104,auVar103);
  auVar101 = vmaxps_avx(auVar101,auVar104);
  auVar104._8_4_ = 0x3f7ffffa;
  auVar104._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar104._12_4_ = 0x3f7ffffa;
  auVar104._16_4_ = 0x3f7ffffa;
  auVar104._20_4_ = 0x3f7ffffa;
  auVar104._24_4_ = 0x3f7ffffa;
  auVar104._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar101,auVar104);
  auVar101 = vpmaxsd_avx2(auVar93,auVar108);
  auVar104 = vpmaxsd_avx2(auVar94,auVar107);
  auVar101 = vminps_avx(auVar101,auVar104);
  auVar104 = vpmaxsd_avx2(auVar105,auVar106);
  uVar153 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar102._4_4_ = uVar153;
  auVar102._0_4_ = uVar153;
  auVar102._8_4_ = uVar153;
  auVar102._12_4_ = uVar153;
  auVar102._16_4_ = uVar153;
  auVar102._20_4_ = uVar153;
  auVar102._24_4_ = uVar153;
  auVar102._28_4_ = uVar153;
  auVar104 = vminps_avx512vl(auVar104,auVar102);
  auVar101 = vminps_avx(auVar101,auVar104);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar101 = vmulps_avx512vl(auVar101,auVar98);
  uVar154 = vcmpps_avx512vl(local_80,auVar101,2);
  uVar23 = vpcmpgtd_avx512vl(auVar87,_DAT_01fb4ba0);
  local_528 = (ulong)(byte)((byte)uVar154 & (byte)uVar23);
  local_530 = pre->ray_space + k;
  local_4f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar203 = ZEXT464(0xbf800000);
  local_5e0 = prim;
  local_540 = pre;
  do {
    if (local_528 == 0) {
      return;
    }
    lVar72 = 0;
    for (uVar76 = local_528; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
      lVar72 = lVar72 + 1;
    }
    uVar73 = *(uint *)(prim + 2);
    local_5d8 = (ulong)uVar73;
    uVar68 = *(uint *)(prim + lVar72 * 4 + 6);
    uVar76 = (ulong)uVar68;
    pGVar71 = (context->scene->geometries).items[local_5d8].ptr;
    uVar66 = (ulong)*(uint *)(*(long *)&pGVar71->field_0x58 +
                             uVar76 * pGVar71[1].super_RefCount.refCounter.
                                      super___atomic_base<unsigned_long>._M_i);
    fVar158 = (pGVar71->time_range).lower;
    fVar158 = pGVar71->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar158) / ((pGVar71->time_range).upper - fVar158))
    ;
    auVar81 = vroundss_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),9);
    auVar80 = vaddss_avx512f(ZEXT416((uint)pGVar71->fnumTimeSegments),auVar203._0_16_);
    auVar81 = vminss_avx(auVar81,auVar80);
    auVar81 = vmaxss_avx(ZEXT816(0) << 0x20,auVar81);
    fVar158 = fVar158 - auVar81._0_4_;
    _Var14 = pGVar71[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar70 = (long)(int)auVar81._0_4_ * 0x38;
    lVar72 = *(long *)(_Var14 + 0x10 + lVar70);
    lVar69 = *(long *)(_Var14 + 0x38 + lVar70);
    lVar15 = *(long *)(_Var14 + 0x48 + lVar70);
    auVar155._4_4_ = fVar158;
    auVar155._0_4_ = fVar158;
    auVar155._8_4_ = fVar158;
    auVar155._12_4_ = fVar158;
    pfVar3 = (float *)(lVar69 + uVar66 * lVar15);
    auVar195._0_4_ = fVar158 * *pfVar3;
    auVar195._4_4_ = fVar158 * pfVar3[1];
    auVar195._8_4_ = fVar158 * pfVar3[2];
    auVar195._12_4_ = fVar158 * pfVar3[3];
    pfVar3 = (float *)(lVar69 + (uVar66 + 1) * lVar15);
    auVar198._0_4_ = fVar158 * *pfVar3;
    auVar198._4_4_ = fVar158 * pfVar3[1];
    auVar198._8_4_ = fVar158 * pfVar3[2];
    auVar198._12_4_ = fVar158 * pfVar3[3];
    auVar81 = vmulps_avx512vl(auVar155,*(undefined1 (*) [16])(lVar69 + (uVar66 + 2) * lVar15));
    auVar80 = vmulps_avx512vl(auVar155,*(undefined1 (*) [16])(lVar69 + lVar15 * (uVar66 + 3)));
    lVar69 = *(long *)(_Var14 + lVar70);
    fVar158 = 1.0 - fVar158;
    auVar84._4_4_ = fVar158;
    auVar84._0_4_ = fVar158;
    auVar84._8_4_ = fVar158;
    auVar84._12_4_ = fVar158;
    local_5a0 = vfmadd231ps_fma(auVar195,auVar84,*(undefined1 (*) [16])(lVar69 + lVar72 * uVar66));
    local_5b0 = vfmadd231ps_fma(auVar198,auVar84,
                                *(undefined1 (*) [16])(lVar69 + lVar72 * (uVar66 + 1)));
    local_5c0 = vfmadd231ps_avx512vl
                          (auVar81,auVar84,*(undefined1 (*) [16])(lVar69 + lVar72 * (uVar66 + 2)));
    _local_5d0 = vfmadd231ps_avx512vl
                           (auVar80,auVar84,*(undefined1 (*) [16])(lVar69 + lVar72 * (uVar66 + 3)));
    iVar12 = (int)pGVar71[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar82 = vsubps_avx(local_5a0,auVar81);
    uVar153 = auVar82._0_4_;
    auVar85._4_4_ = uVar153;
    auVar85._0_4_ = uVar153;
    auVar85._8_4_ = uVar153;
    auVar85._12_4_ = uVar153;
    auVar80 = vshufps_avx(auVar82,auVar82,0x55);
    aVar4 = (local_530->vx).field_0;
    aVar5 = (local_530->vy).field_0;
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    fVar158 = (local_530->vz).field_0.m128[0];
    fVar188 = *(float *)((long)&(local_530->vz).field_0 + 4);
    fVar190 = *(float *)((long)&(local_530->vz).field_0 + 8);
    fVar191 = *(float *)((long)&(local_530->vz).field_0 + 0xc);
    auVar189._0_4_ = fVar158 * auVar82._0_4_;
    auVar189._4_4_ = fVar188 * auVar82._4_4_;
    auVar189._8_4_ = fVar190 * auVar82._8_4_;
    auVar189._12_4_ = fVar191 * auVar82._12_4_;
    auVar80 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar5,auVar80);
    auVar6 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar85);
    auVar82 = vsubps_avx(local_5b0,auVar81);
    uVar153 = auVar82._0_4_;
    auVar86._4_4_ = uVar153;
    auVar86._0_4_ = uVar153;
    auVar86._8_4_ = uVar153;
    auVar86._12_4_ = uVar153;
    auVar80 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar192._0_4_ = fVar158 * auVar82._0_4_;
    auVar192._4_4_ = fVar188 * auVar82._4_4_;
    auVar192._8_4_ = fVar190 * auVar82._8_4_;
    auVar192._12_4_ = fVar191 * auVar82._12_4_;
    auVar80 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar5,auVar80);
    auVar7 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar86);
    auVar82 = vsubps_avx512vl(local_5c0,auVar81);
    uVar153 = auVar82._0_4_;
    auVar166._4_4_ = uVar153;
    auVar166._0_4_ = uVar153;
    auVar166._8_4_ = uVar153;
    auVar166._12_4_ = uVar153;
    auVar80 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar194._0_4_ = fVar158 * auVar82._0_4_;
    auVar194._4_4_ = fVar188 * auVar82._4_4_;
    auVar194._8_4_ = fVar190 * auVar82._8_4_;
    auVar194._12_4_ = fVar191 * auVar82._12_4_;
    auVar80 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar5,auVar80);
    auVar82 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar166);
    auVar80 = vsubps_avx512vl(_local_5d0,auVar81);
    uVar153 = auVar80._0_4_;
    auVar167._4_4_ = uVar153;
    auVar167._0_4_ = uVar153;
    auVar167._8_4_ = uVar153;
    auVar167._12_4_ = uVar153;
    auVar81 = vshufps_avx(auVar80,auVar80,0x55);
    auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
    auVar197._0_4_ = fVar158 * auVar80._0_4_;
    auVar197._4_4_ = fVar188 * auVar80._4_4_;
    auVar197._8_4_ = fVar190 * auVar80._8_4_;
    auVar197._12_4_ = fVar191 * auVar80._12_4_;
    auVar81 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar81);
    lVar72 = (long)iVar12 * 0x44;
    auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar72);
    auVar8 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar167);
    uVar153 = auVar6._0_4_;
    local_2e0._4_4_ = uVar153;
    local_2e0._0_4_ = uVar153;
    local_2e0._8_4_ = uVar153;
    local_2e0._12_4_ = uVar153;
    local_2e0._16_4_ = uVar153;
    local_2e0._20_4_ = uVar153;
    local_2e0._24_4_ = uVar153;
    local_2e0._28_4_ = uVar153;
    auVar87._8_4_ = 1;
    auVar87._0_8_ = 0x100000001;
    auVar87._12_4_ = 1;
    auVar87._16_4_ = 1;
    auVar87._20_4_ = 1;
    auVar87._24_4_ = 1;
    auVar87._28_4_ = 1;
    local_300 = vpermps_avx2(auVar87,ZEXT1632(auVar6));
    auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x484);
    uVar153 = auVar7._0_4_;
    auVar168._4_4_ = uVar153;
    auVar168._0_4_ = uVar153;
    auVar168._8_4_ = uVar153;
    auVar168._12_4_ = uVar153;
    local_320._16_4_ = uVar153;
    local_320._0_16_ = auVar168;
    local_320._20_4_ = uVar153;
    local_320._24_4_ = uVar153;
    local_320._28_4_ = uVar153;
    local_340 = vpermps_avx512vl(auVar87,ZEXT1632(auVar7));
    auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x908);
    local_360 = vbroadcastss_avx512vl(auVar82);
    auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0xd8c);
    local_380 = vpermps_avx512vl(auVar87,ZEXT1632(auVar82));
    uVar153 = auVar8._0_4_;
    local_3a0._4_4_ = uVar153;
    local_3a0._0_4_ = uVar153;
    fStack_398 = (float)uVar153;
    fStack_394 = (float)uVar153;
    fStack_390 = (float)uVar153;
    fStack_38c = (float)uVar153;
    fStack_388 = (float)uVar153;
    register0x0000139c = uVar153;
    _local_3c0 = vpermps_avx512vl(auVar87,ZEXT1632(auVar8));
    auVar98 = vmulps_avx512vl(_local_3a0,auVar102);
    auVar99 = vmulps_avx512vl(_local_3c0,auVar102);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_360);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_380);
    auVar81 = vfmadd231ps_fma(auVar98,auVar104,local_320);
    auVar94 = vfmadd231ps_avx512vl(auVar99,auVar104,local_340);
    auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar101,local_2e0);
    auVar184 = ZEXT3264(auVar105);
    auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar72);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x484);
    auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x908);
    auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0xd8c);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_300);
    auVar179 = ZEXT3264(auVar94);
    auVar106 = vmulps_avx512vl(_local_3a0,auVar93);
    auVar107 = vmulps_avx512vl(_local_3c0,auVar93);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar100,local_360);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,local_380);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar99,local_320);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar99,local_340);
    auVar9 = vfmadd231ps_fma(auVar106,auVar98,local_2e0);
    auVar186 = ZEXT1664(auVar9);
    auVar10 = vfmadd231ps_fma(auVar107,auVar98,local_300);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar9),auVar105);
    auVar107 = vsubps_avx512vl(ZEXT1632(auVar10),auVar94);
    auVar108 = vmulps_avx512vl(auVar94,auVar106);
    auVar87 = vmulps_avx512vl(auVar105,auVar107);
    auVar108 = vsubps_avx512vl(auVar108,auVar87);
    auVar81 = vshufps_avx(local_5a0,local_5a0,0xff);
    uVar154 = auVar81._0_8_;
    local_a0._8_8_ = uVar154;
    local_a0._0_8_ = uVar154;
    local_a0._16_8_ = uVar154;
    local_a0._24_8_ = uVar154;
    auVar81 = vshufps_avx(local_5b0,local_5b0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar81);
    auVar81 = vshufps_avx512vl(local_5c0,local_5c0,0xff);
    local_e0 = vbroadcastsd_avx512vl(auVar81);
    auVar81 = vshufps_avx512vl(_local_5d0,_local_5d0,0xff);
    uVar154 = auVar81._0_8_;
    local_100._8_8_ = uVar154;
    local_100._0_8_ = uVar154;
    local_100._16_8_ = uVar154;
    local_100._24_8_ = uVar154;
    auVar87 = vmulps_avx512vl(local_100,auVar102);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar103,local_e0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar104,local_c0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar101,local_a0);
    auVar88 = vmulps_avx512vl(local_100,auVar93);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar100,local_e0);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar99,local_c0);
    auVar11 = vfmadd231ps_fma(auVar88,auVar98,local_a0);
    auVar88 = vmulps_avx512vl(auVar107,auVar107);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar106,auVar106);
    auVar89 = vmaxps_avx512vl(auVar87,ZEXT1632(auVar11));
    auVar89 = vmulps_avx512vl(auVar89,auVar89);
    auVar88 = vmulps_avx512vl(auVar89,auVar88);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    uVar154 = vcmpps_avx512vl(auVar108,auVar88,2);
    auVar81 = vblendps_avx(auVar6,local_5a0,8);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar80 = vandps_avx512vl(auVar81,auVar83);
    auVar81 = vblendps_avx(auVar7,local_5b0,8);
    auVar81 = vandps_avx512vl(auVar81,auVar83);
    auVar80 = vmaxps_avx(auVar80,auVar81);
    auVar81 = vblendps_avx(auVar82,local_5c0,8);
    auVar84 = vandps_avx512vl(auVar81,auVar83);
    auVar81 = vblendps_avx(auVar8,_local_5d0,8);
    auVar81 = vandps_avx512vl(auVar81,auVar83);
    auVar81 = vmaxps_avx(auVar84,auVar81);
    auVar81 = vmaxps_avx(auVar80,auVar81);
    auVar80 = vmovshdup_avx(auVar81);
    auVar80 = vmaxss_avx(auVar80,auVar81);
    auVar81 = vshufpd_avx(auVar81,auVar81,1);
    auVar81 = vmaxss_avx(auVar81,auVar80);
    auVar80 = vcvtsi2ss_avx512f(local_5c0,iVar12);
    local_520._0_16_ = auVar80;
    auVar88._0_4_ = auVar80._0_4_;
    auVar88._4_4_ = auVar88._0_4_;
    auVar88._8_4_ = auVar88._0_4_;
    auVar88._12_4_ = auVar88._0_4_;
    auVar88._16_4_ = auVar88._0_4_;
    auVar88._20_4_ = auVar88._0_4_;
    auVar88._24_4_ = auVar88._0_4_;
    auVar88._28_4_ = auVar88._0_4_;
    uVar23 = vcmpps_avx512vl(auVar88,_DAT_01f7b060,0xe);
    bVar74 = (byte)uVar154 & (byte)uVar23;
    fVar158 = auVar81._0_4_ * 4.7683716e-07;
    local_560 = ZEXT416((uint)fVar158);
    auVar108 = auVar201._0_32_;
    local_140 = vpermps_avx512vl(auVar108,ZEXT1632(auVar6));
    local_160 = vpermps_avx512vl(auVar108,ZEXT1632(auVar7));
    local_180 = vpermps_avx512vl(auVar108,ZEXT1632(auVar82));
    local_1a0 = vpermps_avx512vl(auVar108,ZEXT1632(auVar8));
    local_480 = *(undefined4 *)(ray + k * 4 + 0x30);
    uStack_47c = 0;
    uStack_478 = 0;
    uStack_474 = 0;
    local_4d0 = vpbroadcastd_avx512vl();
    local_4e0 = vpbroadcastd_avx512vl();
    if (bVar74 != 0) {
      auVar93 = vmulps_avx512vl(local_1a0,auVar93);
      auVar100 = vfmadd213ps_avx512vl(auVar100,local_180,auVar93);
      auVar99 = vfmadd213ps_avx512vl(auVar99,local_160,auVar100);
      auVar99 = vfmadd213ps_avx512vl(auVar98,local_140,auVar99);
      auVar102 = vmulps_avx512vl(local_1a0,auVar102);
      auVar103 = vfmadd213ps_avx512vl(auVar103,local_180,auVar102);
      auVar100 = vfmadd213ps_avx512vl(auVar104,local_160,auVar103);
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x1210);
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x1694);
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x1f9c);
      auVar100 = vfmadd213ps_avx512vl(auVar101,local_140,auVar100);
      auVar101 = vmulps_avx512vl(_local_3a0,auVar98);
      auVar93 = vmulps_avx512vl(_local_3c0,auVar98);
      auVar98 = vmulps_avx512vl(local_1a0,auVar98);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar102,local_360);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar102,local_380);
      auVar102 = vfmadd231ps_avx512vl(auVar98,local_180,auVar102);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,local_320);
      auVar98 = vfmadd231ps_avx512vl(auVar93,auVar103,local_340);
      auVar93 = vfmadd231ps_avx512vl(auVar102,local_160,auVar103);
      auVar81 = vfmadd231ps_fma(auVar101,auVar104,local_2e0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,local_300);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x1210);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x1b18);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x1f9c);
      auVar93 = vfmadd231ps_avx512vl(auVar93,local_140,auVar104);
      auVar104 = vmulps_avx512vl(_local_3a0,auVar102);
      auVar108 = vmulps_avx512vl(_local_3c0,auVar102);
      auVar102 = vmulps_avx512vl(local_1a0,auVar102);
      auVar89 = vfmadd231ps_avx512vl(auVar104,auVar103,local_360);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,local_380);
      auVar103 = vfmadd231ps_avx512vl(auVar102,local_180,auVar103);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x1694);
      auVar102 = vfmadd231ps_avx512vl(auVar89,auVar104,local_320);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,local_340);
      auVar104 = vfmadd231ps_avx512vl(auVar103,local_160,auVar104);
      auVar203 = ZEXT1664(auVar203._0_16_);
      auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar201 = ZEXT3264(auVar103);
      auVar80 = vfmadd231ps_fma(auVar102,auVar101,local_2e0);
      auVar103 = vfmadd231ps_avx512vl(auVar108,auVar101,local_300);
      auVar102 = vfmadd231ps_avx512vl(auVar104,local_140,auVar101);
      auVar199._8_4_ = 0x7fffffff;
      auVar199._0_8_ = 0x7fffffff7fffffff;
      auVar199._12_4_ = 0x7fffffff;
      auVar199._16_4_ = 0x7fffffff;
      auVar199._20_4_ = 0x7fffffff;
      auVar199._24_4_ = 0x7fffffff;
      auVar199._28_4_ = 0x7fffffff;
      auVar101 = vandps_avx(ZEXT1632(auVar81),auVar199);
      auVar104 = vandps_avx(auVar98,auVar199);
      auVar104 = vmaxps_avx(auVar101,auVar104);
      auVar101 = vandps_avx(auVar93,auVar199);
      auVar101 = vmaxps_avx(auVar104,auVar101);
      auVar196._4_4_ = fVar158;
      auVar196._0_4_ = fVar158;
      auVar196._8_4_ = fVar158;
      auVar196._12_4_ = fVar158;
      auVar196._16_4_ = fVar158;
      auVar196._20_4_ = fVar158;
      auVar196._24_4_ = fVar158;
      auVar196._28_4_ = fVar158;
      uVar66 = vcmpps_avx512vl(auVar101,auVar196,1);
      bVar17 = (bool)((byte)uVar66 & 1);
      auVar109._0_4_ = (float)((uint)bVar17 * auVar106._0_4_ | (uint)!bVar17 * auVar81._0_4_);
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar81._4_4_);
      bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar81._8_4_);
      bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar81._12_4_);
      fVar190 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar106._16_4_);
      auVar109._16_4_ = fVar190;
      fVar188 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar106._20_4_);
      auVar109._20_4_ = fVar188;
      fVar191 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar106._24_4_);
      auVar109._24_4_ = fVar191;
      uVar67 = (uint)(byte)(uVar66 >> 7) * auVar106._28_4_;
      auVar109._28_4_ = uVar67;
      bVar17 = (bool)((byte)uVar66 & 1);
      auVar110._0_4_ = (float)((uint)bVar17 * auVar107._0_4_ | (uint)!bVar17 * auVar98._0_4_);
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar98._4_4_);
      bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar98._8_4_);
      bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar98._12_4_);
      bVar17 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar17 * auVar107._16_4_ | (uint)!bVar17 * auVar98._16_4_);
      bVar17 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar17 * auVar107._20_4_ | (uint)!bVar17 * auVar98._20_4_);
      bVar17 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar17 * auVar107._24_4_ | (uint)!bVar17 * auVar98._24_4_);
      bVar17 = SUB81(uVar66 >> 7,0);
      auVar110._28_4_ = (uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar98._28_4_;
      auVar101 = vandps_avx(auVar199,ZEXT1632(auVar80));
      auVar104 = vandps_avx(auVar103,auVar199);
      auVar104 = vmaxps_avx(auVar101,auVar104);
      auVar101 = vandps_avx(auVar102,auVar199);
      auVar101 = vmaxps_avx(auVar104,auVar101);
      uVar66 = vcmpps_avx512vl(auVar101,auVar196,1);
      bVar17 = (bool)((byte)uVar66 & 1);
      auVar111._0_4_ = (float)((uint)bVar17 * auVar106._0_4_ | (uint)!bVar17 * auVar80._0_4_);
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar80._4_4_);
      bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar80._8_4_);
      bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar80._12_4_);
      fVar165 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar106._16_4_);
      auVar111._16_4_ = fVar165;
      fVar157 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar106._20_4_);
      auVar111._20_4_ = fVar157;
      fVar164 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar106._24_4_);
      auVar111._24_4_ = fVar164;
      auVar111._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar106._28_4_;
      bVar17 = (bool)((byte)uVar66 & 1);
      auVar112._0_4_ = (float)((uint)bVar17 * auVar107._0_4_ | (uint)!bVar17 * auVar103._0_4_);
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar103._4_4_);
      bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar103._8_4_);
      bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar103._12_4_);
      bVar17 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar17 * auVar107._16_4_ | (uint)!bVar17 * auVar103._16_4_);
      bVar17 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar17 * auVar107._20_4_ | (uint)!bVar17 * auVar103._20_4_);
      bVar17 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar17 * auVar107._24_4_ | (uint)!bVar17 * auVar103._24_4_);
      bVar17 = SUB81(uVar66 >> 7,0);
      auVar112._28_4_ = (uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar103._28_4_;
      auVar85 = vxorps_avx512vl(auVar168,auVar168);
      auVar101 = vfmadd213ps_avx512vl(auVar109,auVar109,ZEXT1632(auVar85));
      auVar81 = vfmadd231ps_fma(auVar101,auVar110,auVar110);
      auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
      fVar78 = auVar101._0_4_;
      fVar79 = auVar101._4_4_;
      fVar134 = auVar101._8_4_;
      fVar135 = auVar101._12_4_;
      fVar136 = auVar101._16_4_;
      fVar137 = auVar101._20_4_;
      fVar138 = auVar101._24_4_;
      auVar96._4_4_ = fVar79 * fVar79 * fVar79 * auVar81._4_4_ * -0.5;
      auVar96._0_4_ = fVar78 * fVar78 * fVar78 * auVar81._0_4_ * -0.5;
      auVar96._8_4_ = fVar134 * fVar134 * fVar134 * auVar81._8_4_ * -0.5;
      auVar96._12_4_ = fVar135 * fVar135 * fVar135 * auVar81._12_4_ * -0.5;
      auVar96._16_4_ = fVar136 * fVar136 * fVar136 * -0.0;
      auVar96._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
      auVar96._24_4_ = fVar138 * fVar138 * fVar138 * -0.0;
      auVar96._28_4_ = 0;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar103 = vfmadd231ps_avx512vl(auVar96,auVar104,auVar101);
      auVar97._4_4_ = auVar110._4_4_ * auVar103._4_4_;
      auVar97._0_4_ = auVar110._0_4_ * auVar103._0_4_;
      auVar97._8_4_ = auVar110._8_4_ * auVar103._8_4_;
      auVar97._12_4_ = auVar110._12_4_ * auVar103._12_4_;
      auVar97._16_4_ = auVar110._16_4_ * auVar103._16_4_;
      auVar97._20_4_ = auVar110._20_4_ * auVar103._20_4_;
      auVar97._24_4_ = auVar110._24_4_ * auVar103._24_4_;
      auVar97._28_4_ = auVar101._28_4_;
      auVar32._4_4_ = auVar103._4_4_ * -auVar109._4_4_;
      auVar32._0_4_ = auVar103._0_4_ * -auVar109._0_4_;
      auVar32._8_4_ = auVar103._8_4_ * -auVar109._8_4_;
      auVar32._12_4_ = auVar103._12_4_ * -auVar109._12_4_;
      auVar32._16_4_ = auVar103._16_4_ * -fVar190;
      auVar32._20_4_ = auVar103._20_4_ * -fVar188;
      auVar32._24_4_ = auVar103._24_4_ * -fVar191;
      auVar32._28_4_ = uVar67 ^ 0x80000000;
      auVar101 = vmulps_avx512vl(auVar103,ZEXT1632(auVar85));
      auVar106 = ZEXT1632(auVar85);
      auVar102 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar106);
      auVar81 = vfmadd231ps_fma(auVar102,auVar112,auVar112);
      auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
      fVar188 = auVar102._0_4_;
      fVar190 = auVar102._4_4_;
      fVar191 = auVar102._8_4_;
      fVar78 = auVar102._12_4_;
      fVar79 = auVar102._16_4_;
      fVar134 = auVar102._20_4_;
      fVar135 = auVar102._24_4_;
      auVar33._4_4_ = fVar190 * fVar190 * fVar190 * auVar81._4_4_ * -0.5;
      auVar33._0_4_ = fVar188 * fVar188 * fVar188 * auVar81._0_4_ * -0.5;
      auVar33._8_4_ = fVar191 * fVar191 * fVar191 * auVar81._8_4_ * -0.5;
      auVar33._12_4_ = fVar78 * fVar78 * fVar78 * auVar81._12_4_ * -0.5;
      auVar33._16_4_ = fVar79 * fVar79 * fVar79 * -0.0;
      auVar33._20_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar33._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar33._28_4_ = 0;
      auVar104 = vfmadd231ps_avx512vl(auVar33,auVar104,auVar102);
      auVar34._4_4_ = auVar112._4_4_ * auVar104._4_4_;
      auVar34._0_4_ = auVar112._0_4_ * auVar104._0_4_;
      auVar34._8_4_ = auVar112._8_4_ * auVar104._8_4_;
      auVar34._12_4_ = auVar112._12_4_ * auVar104._12_4_;
      auVar34._16_4_ = auVar112._16_4_ * auVar104._16_4_;
      auVar34._20_4_ = auVar112._20_4_ * auVar104._20_4_;
      auVar34._24_4_ = auVar112._24_4_ * auVar104._24_4_;
      auVar34._28_4_ = auVar102._28_4_;
      auVar35._4_4_ = -auVar111._4_4_ * auVar104._4_4_;
      auVar35._0_4_ = -auVar111._0_4_ * auVar104._0_4_;
      auVar35._8_4_ = -auVar111._8_4_ * auVar104._8_4_;
      auVar35._12_4_ = -auVar111._12_4_ * auVar104._12_4_;
      auVar35._16_4_ = -fVar165 * auVar104._16_4_;
      auVar35._20_4_ = -fVar157 * auVar104._20_4_;
      auVar35._24_4_ = -fVar164 * auVar104._24_4_;
      auVar35._28_4_ = auVar103._28_4_;
      auVar104 = vmulps_avx512vl(auVar104,auVar106);
      auVar81 = vfmadd213ps_fma(auVar97,auVar87,auVar105);
      auVar80 = vfmadd213ps_fma(auVar32,auVar87,auVar94);
      auVar103 = vfmadd213ps_avx512vl(auVar101,auVar87,auVar100);
      auVar102 = vfmadd213ps_avx512vl(auVar34,ZEXT1632(auVar11),ZEXT1632(auVar9));
      auVar83 = vfnmadd213ps_fma(auVar97,auVar87,auVar105);
      auVar93 = ZEXT1632(auVar11);
      auVar82 = vfmadd213ps_fma(auVar35,auVar93,ZEXT1632(auVar10));
      auVar84 = vfnmadd213ps_fma(auVar32,auVar87,auVar94);
      auVar6 = vfmadd213ps_fma(auVar104,auVar93,auVar99);
      auVar98 = vfnmadd231ps_avx512vl(auVar100,auVar87,auVar101);
      auVar9 = vfnmadd213ps_fma(auVar34,auVar93,ZEXT1632(auVar9));
      auVar10 = vfnmadd213ps_fma(auVar35,auVar93,ZEXT1632(auVar10));
      auVar155 = vfnmadd231ps_fma(auVar99,ZEXT1632(auVar11),auVar104);
      auVar104 = vsubps_avx512vl(auVar102,ZEXT1632(auVar83));
      auVar101 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar84));
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar6),auVar98);
      auVar100 = vmulps_avx512vl(auVar101,auVar98);
      auVar7 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar84),auVar99);
      auVar36._4_4_ = auVar83._4_4_ * auVar99._4_4_;
      auVar36._0_4_ = auVar83._0_4_ * auVar99._0_4_;
      auVar36._8_4_ = auVar83._8_4_ * auVar99._8_4_;
      auVar36._12_4_ = auVar83._12_4_ * auVar99._12_4_;
      auVar36._16_4_ = auVar99._16_4_ * 0.0;
      auVar36._20_4_ = auVar99._20_4_ * 0.0;
      auVar36._24_4_ = auVar99._24_4_ * 0.0;
      auVar36._28_4_ = auVar99._28_4_;
      auVar99 = vfmsub231ps_avx512vl(auVar36,auVar98,auVar104);
      auVar37._4_4_ = auVar84._4_4_ * auVar104._4_4_;
      auVar37._0_4_ = auVar84._0_4_ * auVar104._0_4_;
      auVar37._8_4_ = auVar84._8_4_ * auVar104._8_4_;
      auVar37._12_4_ = auVar84._12_4_ * auVar104._12_4_;
      auVar37._16_4_ = auVar104._16_4_ * 0.0;
      auVar37._20_4_ = auVar104._20_4_ * 0.0;
      auVar37._24_4_ = auVar104._24_4_ * 0.0;
      auVar37._28_4_ = auVar104._28_4_;
      auVar8 = vfmsub231ps_fma(auVar37,ZEXT1632(auVar83),auVar101);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar106,auVar99);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,ZEXT1632(auVar7));
      auVar107 = ZEXT1632(auVar85);
      uVar66 = vcmpps_avx512vl(auVar101,auVar107,2);
      bVar65 = (byte)uVar66;
      fVar78 = (float)((uint)(bVar65 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar9._0_4_
                      );
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      fVar134 = (float)((uint)bVar17 * auVar81._4_4_ | (uint)!bVar17 * auVar9._4_4_);
      bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
      fVar136 = (float)((uint)bVar17 * auVar81._8_4_ | (uint)!bVar17 * auVar9._8_4_);
      bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
      fVar138 = (float)((uint)bVar17 * auVar81._12_4_ | (uint)!bVar17 * auVar9._12_4_);
      auVar100 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar78))));
      fVar79 = (float)((uint)(bVar65 & 1) * auVar80._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar10._0_4_);
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      fVar135 = (float)((uint)bVar17 * auVar80._4_4_ | (uint)!bVar17 * auVar10._4_4_);
      bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
      fVar137 = (float)((uint)bVar17 * auVar80._8_4_ | (uint)!bVar17 * auVar10._8_4_);
      bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
      fVar139 = (float)((uint)bVar17 * auVar80._12_4_ | (uint)!bVar17 * auVar10._12_4_);
      auVar93 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar79))));
      auVar113._0_4_ =
           (float)((uint)(bVar65 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar155._0_4_)
      ;
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar155._4_4_);
      bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar155._8_4_);
      bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar155._12_4_);
      fVar191 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar103._16_4_);
      auVar113._16_4_ = fVar191;
      fVar188 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar103._20_4_);
      auVar113._20_4_ = fVar188;
      fVar190 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar103._24_4_);
      auVar113._24_4_ = fVar190;
      iVar1 = (uint)(byte)(uVar66 >> 7) * auVar103._28_4_;
      auVar113._28_4_ = iVar1;
      auVar104 = vblendmps_avx512vl(ZEXT1632(auVar83),auVar102);
      auVar114._0_4_ =
           (uint)(bVar65 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar80._0_4_;
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * auVar80._4_4_;
      bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * auVar80._8_4_;
      bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * auVar80._12_4_;
      auVar114._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar104._16_4_;
      auVar114._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar104._20_4_;
      auVar114._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar104._24_4_;
      auVar114._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar104._28_4_;
      auVar104 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar82));
      auVar115._0_4_ =
           (float)((uint)(bVar65 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar7._0_4_);
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * auVar7._4_4_);
      bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * auVar7._8_4_);
      bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * auVar7._12_4_);
      fVar164 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar104._16_4_);
      auVar115._16_4_ = fVar164;
      fVar157 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar104._20_4_);
      auVar115._20_4_ = fVar157;
      fVar165 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar104._24_4_);
      auVar115._24_4_ = fVar165;
      auVar115._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar104._28_4_;
      auVar104 = vblendmps_avx512vl(auVar98,ZEXT1632(auVar6));
      auVar116._0_4_ =
           (float)((uint)(bVar65 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar103._0_4_)
      ;
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * auVar103._4_4_);
      bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * auVar103._8_4_);
      bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * auVar103._12_4_);
      bVar17 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar116._16_4_ = (float)((uint)bVar17 * auVar104._16_4_ | (uint)!bVar17 * auVar103._16_4_);
      bVar17 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar116._20_4_ = (float)((uint)bVar17 * auVar104._20_4_ | (uint)!bVar17 * auVar103._20_4_);
      bVar17 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar116._24_4_ = (float)((uint)bVar17 * auVar104._24_4_ | (uint)!bVar17 * auVar103._24_4_);
      bVar17 = SUB81(uVar66 >> 7,0);
      auVar116._28_4_ = (uint)bVar17 * auVar104._28_4_ | (uint)!bVar17 * auVar103._28_4_;
      auVar117._0_4_ =
           (uint)(bVar65 & 1) * (int)auVar83._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar102._0_4_;
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar17 * (int)auVar83._4_4_ | (uint)!bVar17 * auVar102._4_4_;
      bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar17 * (int)auVar83._8_4_ | (uint)!bVar17 * auVar102._8_4_;
      bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar17 * (int)auVar83._12_4_ | (uint)!bVar17 * auVar102._12_4_;
      auVar117._16_4_ = (uint)!(bool)((byte)(uVar66 >> 4) & 1) * auVar102._16_4_;
      auVar117._20_4_ = (uint)!(bool)((byte)(uVar66 >> 5) & 1) * auVar102._20_4_;
      auVar117._24_4_ = (uint)!(bool)((byte)(uVar66 >> 6) & 1) * auVar102._24_4_;
      auVar117._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar102._28_4_;
      bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
      bVar19 = (bool)((byte)(uVar66 >> 2) & 1);
      bVar20 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar118._0_4_ = (uint)(bVar65 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar6._0_4_
      ;
      bVar18 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar18 * auVar98._4_4_ | (uint)!bVar18 * auVar6._4_4_;
      bVar18 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar18 * auVar98._8_4_ | (uint)!bVar18 * auVar6._8_4_;
      bVar18 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar18 * auVar98._12_4_ | (uint)!bVar18 * auVar6._12_4_;
      auVar118._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar98._16_4_;
      auVar118._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar98._20_4_;
      auVar118._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar98._24_4_;
      iVar2 = (uint)(byte)(uVar66 >> 7) * auVar98._28_4_;
      auVar118._28_4_ = iVar2;
      auVar94 = vsubps_avx512vl(auVar117,auVar100);
      auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar84._12_4_ |
                                               (uint)!bVar20 * auVar82._12_4_,
                                               CONCAT48((uint)bVar19 * (int)auVar84._8_4_ |
                                                        (uint)!bVar19 * auVar82._8_4_,
                                                        CONCAT44((uint)bVar17 * (int)auVar84._4_4_ |
                                                                 (uint)!bVar17 * auVar82._4_4_,
                                                                 (uint)(bVar65 & 1) *
                                                                 (int)auVar84._0_4_ |
                                                                 (uint)!(bool)(bVar65 & 1) *
                                                                 auVar82._0_4_)))),auVar93);
      auVar184 = ZEXT3264(auVar104);
      auVar103 = vsubps_avx(auVar118,auVar113);
      auVar102 = vsubps_avx(auVar100,auVar114);
      auVar186 = ZEXT3264(auVar102);
      auVar98 = vsubps_avx(auVar93,auVar115);
      auVar99 = vsubps_avx(auVar113,auVar116);
      auVar38._4_4_ = auVar103._4_4_ * fVar134;
      auVar38._0_4_ = auVar103._0_4_ * fVar78;
      auVar38._8_4_ = auVar103._8_4_ * fVar136;
      auVar38._12_4_ = auVar103._12_4_ * fVar138;
      auVar38._16_4_ = auVar103._16_4_ * 0.0;
      auVar38._20_4_ = auVar103._20_4_ * 0.0;
      auVar38._24_4_ = auVar103._24_4_ * 0.0;
      auVar38._28_4_ = iVar2;
      auVar81 = vfmsub231ps_fma(auVar38,auVar113,auVar94);
      auVar39._4_4_ = fVar135 * auVar94._4_4_;
      auVar39._0_4_ = fVar79 * auVar94._0_4_;
      auVar39._8_4_ = fVar137 * auVar94._8_4_;
      auVar39._12_4_ = fVar139 * auVar94._12_4_;
      auVar39._16_4_ = auVar94._16_4_ * 0.0;
      auVar39._20_4_ = auVar94._20_4_ * 0.0;
      auVar39._24_4_ = auVar94._24_4_ * 0.0;
      auVar39._28_4_ = auVar101._28_4_;
      auVar80 = vfmsub231ps_fma(auVar39,auVar100,auVar104);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar107,ZEXT1632(auVar81));
      auVar175._0_4_ = auVar104._0_4_ * auVar113._0_4_;
      auVar175._4_4_ = auVar104._4_4_ * auVar113._4_4_;
      auVar175._8_4_ = auVar104._8_4_ * auVar113._8_4_;
      auVar175._12_4_ = auVar104._12_4_ * auVar113._12_4_;
      auVar175._16_4_ = auVar104._16_4_ * fVar191;
      auVar175._20_4_ = auVar104._20_4_ * fVar188;
      auVar175._24_4_ = auVar104._24_4_ * fVar190;
      auVar175._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar175,auVar93,auVar103);
      auVar105 = vfmadd231ps_avx512vl(auVar101,auVar107,ZEXT1632(auVar81));
      auVar101 = vmulps_avx512vl(auVar99,auVar114);
      auVar101 = vfmsub231ps_avx512vl(auVar101,auVar102,auVar116);
      auVar40._4_4_ = auVar98._4_4_ * auVar116._4_4_;
      auVar40._0_4_ = auVar98._0_4_ * auVar116._0_4_;
      auVar40._8_4_ = auVar98._8_4_ * auVar116._8_4_;
      auVar40._12_4_ = auVar98._12_4_ * auVar116._12_4_;
      auVar40._16_4_ = auVar98._16_4_ * auVar116._16_4_;
      auVar40._20_4_ = auVar98._20_4_ * auVar116._20_4_;
      auVar40._24_4_ = auVar98._24_4_ * auVar116._24_4_;
      auVar40._28_4_ = auVar116._28_4_;
      auVar81 = vfmsub231ps_fma(auVar40,auVar115,auVar99);
      auVar176._0_4_ = auVar115._0_4_ * auVar102._0_4_;
      auVar176._4_4_ = auVar115._4_4_ * auVar102._4_4_;
      auVar176._8_4_ = auVar115._8_4_ * auVar102._8_4_;
      auVar176._12_4_ = auVar115._12_4_ * auVar102._12_4_;
      auVar176._16_4_ = fVar164 * auVar102._16_4_;
      auVar176._20_4_ = fVar157 * auVar102._20_4_;
      auVar176._24_4_ = fVar165 * auVar102._24_4_;
      auVar176._28_4_ = 0;
      auVar80 = vfmsub231ps_fma(auVar176,auVar98,auVar114);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar107,auVar101);
      auVar106 = vfmadd231ps_avx512vl(auVar101,auVar107,ZEXT1632(auVar81));
      auVar179 = ZEXT3264(auVar106);
      auVar101 = vmaxps_avx(auVar105,auVar106);
      uVar154 = vcmpps_avx512vl(auVar101,auVar107,2);
      bVar74 = bVar74 & (byte)uVar154;
      if (bVar74 != 0) {
        auVar41._4_4_ = auVar99._4_4_ * auVar104._4_4_;
        auVar41._0_4_ = auVar99._0_4_ * auVar104._0_4_;
        auVar41._8_4_ = auVar99._8_4_ * auVar104._8_4_;
        auVar41._12_4_ = auVar99._12_4_ * auVar104._12_4_;
        auVar41._16_4_ = auVar99._16_4_ * auVar104._16_4_;
        auVar41._20_4_ = auVar99._20_4_ * auVar104._20_4_;
        auVar41._24_4_ = auVar99._24_4_ * auVar104._24_4_;
        auVar41._28_4_ = auVar101._28_4_;
        auVar6 = vfmsub231ps_fma(auVar41,auVar98,auVar103);
        auVar42._4_4_ = auVar103._4_4_ * auVar102._4_4_;
        auVar42._0_4_ = auVar103._0_4_ * auVar102._0_4_;
        auVar42._8_4_ = auVar103._8_4_ * auVar102._8_4_;
        auVar42._12_4_ = auVar103._12_4_ * auVar102._12_4_;
        auVar42._16_4_ = auVar103._16_4_ * auVar102._16_4_;
        auVar42._20_4_ = auVar103._20_4_ * auVar102._20_4_;
        auVar42._24_4_ = auVar103._24_4_ * auVar102._24_4_;
        auVar42._28_4_ = auVar103._28_4_;
        auVar82 = vfmsub231ps_fma(auVar42,auVar94,auVar99);
        auVar43._4_4_ = auVar98._4_4_ * auVar94._4_4_;
        auVar43._0_4_ = auVar98._0_4_ * auVar94._0_4_;
        auVar43._8_4_ = auVar98._8_4_ * auVar94._8_4_;
        auVar43._12_4_ = auVar98._12_4_ * auVar94._12_4_;
        auVar43._16_4_ = auVar98._16_4_ * auVar94._16_4_;
        auVar43._20_4_ = auVar98._20_4_ * auVar94._20_4_;
        auVar43._24_4_ = auVar98._24_4_ * auVar94._24_4_;
        auVar43._28_4_ = auVar98._28_4_;
        auVar7 = vfmsub231ps_fma(auVar43,auVar102,auVar104);
        auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar7));
        auVar80 = vfmadd231ps_fma(ZEXT1632(auVar81),ZEXT1632(auVar6),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar101 = vrcp14ps_avx512vl(ZEXT1632(auVar80));
        auVar103 = auVar202._0_32_;
        auVar104 = vfnmadd213ps_avx512vl(auVar101,ZEXT1632(auVar80),auVar103);
        auVar81 = vfmadd132ps_fma(auVar104,auVar101,auVar101);
        auVar184 = ZEXT1664(auVar81);
        auVar44._4_4_ = auVar7._4_4_ * auVar113._4_4_;
        auVar44._0_4_ = auVar7._0_4_ * auVar113._0_4_;
        auVar44._8_4_ = auVar7._8_4_ * auVar113._8_4_;
        auVar44._12_4_ = auVar7._12_4_ * auVar113._12_4_;
        auVar44._16_4_ = fVar191 * 0.0;
        auVar44._20_4_ = fVar188 * 0.0;
        auVar44._24_4_ = fVar190 * 0.0;
        auVar44._28_4_ = iVar1;
        auVar82 = vfmadd231ps_fma(auVar44,auVar93,ZEXT1632(auVar82));
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar100,ZEXT1632(auVar6));
        fVar188 = auVar81._0_4_;
        fVar190 = auVar81._4_4_;
        fVar191 = auVar81._8_4_;
        fVar165 = auVar81._12_4_;
        fStack_4a4 = (float)auVar101._28_4_;
        _local_4c0 = ZEXT1628(CONCAT412(auVar82._12_4_ * fVar165,
                                        CONCAT48(auVar82._8_4_ * fVar191,
                                                 CONCAT44(auVar82._4_4_ * fVar190,
                                                          auVar82._0_4_ * fVar188))));
        auVar186 = ZEXT3264(_local_4c0);
        auVar146._4_4_ = local_480;
        auVar146._0_4_ = local_480;
        auVar146._8_4_ = local_480;
        auVar146._12_4_ = local_480;
        auVar146._16_4_ = local_480;
        auVar146._20_4_ = local_480;
        auVar146._24_4_ = local_480;
        auVar146._28_4_ = local_480;
        uVar154 = vcmpps_avx512vl(auVar146,_local_4c0,2);
        uVar153 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar25._4_4_ = uVar153;
        auVar25._0_4_ = uVar153;
        auVar25._8_4_ = uVar153;
        auVar25._12_4_ = uVar153;
        auVar25._16_4_ = uVar153;
        auVar25._20_4_ = uVar153;
        auVar25._24_4_ = uVar153;
        auVar25._28_4_ = uVar153;
        uVar23 = vcmpps_avx512vl(_local_4c0,auVar25,2);
        bVar74 = (byte)uVar154 & (byte)uVar23 & bVar74;
        if (bVar74 != 0) {
          uVar75 = vcmpps_avx512vl(ZEXT1632(auVar80),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar75 = bVar74 & uVar75;
          if ((char)uVar75 != '\0') {
            fVar157 = auVar105._0_4_ * fVar188;
            fVar164 = auVar105._4_4_ * fVar190;
            auVar45._4_4_ = fVar164;
            auVar45._0_4_ = fVar157;
            fVar78 = auVar105._8_4_ * fVar191;
            auVar45._8_4_ = fVar78;
            fVar79 = auVar105._12_4_ * fVar165;
            auVar45._12_4_ = fVar79;
            fVar134 = auVar105._16_4_ * 0.0;
            auVar45._16_4_ = fVar134;
            fVar135 = auVar105._20_4_ * 0.0;
            auVar45._20_4_ = fVar135;
            fVar136 = auVar105._24_4_ * 0.0;
            auVar45._24_4_ = fVar136;
            auVar45._28_4_ = auVar105._28_4_;
            auVar101 = vsubps_avx512vl(auVar103,auVar45);
            local_2c0._0_4_ =
                 (float)((uint)(bVar65 & 1) * (int)fVar157 |
                        (uint)!(bool)(bVar65 & 1) * auVar101._0_4_);
            bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
            local_2c0._4_4_ = (float)((uint)bVar17 * (int)fVar164 | (uint)!bVar17 * auVar101._4_4_);
            bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
            local_2c0._8_4_ = (float)((uint)bVar17 * (int)fVar78 | (uint)!bVar17 * auVar101._8_4_);
            bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
            local_2c0._12_4_ = (float)((uint)bVar17 * (int)fVar79 | (uint)!bVar17 * auVar101._12_4_)
            ;
            bVar17 = (bool)((byte)(uVar66 >> 4) & 1);
            local_2c0._16_4_ =
                 (float)((uint)bVar17 * (int)fVar134 | (uint)!bVar17 * auVar101._16_4_);
            bVar17 = (bool)((byte)(uVar66 >> 5) & 1);
            local_2c0._20_4_ =
                 (float)((uint)bVar17 * (int)fVar135 | (uint)!bVar17 * auVar101._20_4_);
            bVar17 = (bool)((byte)(uVar66 >> 6) & 1);
            local_2c0._24_4_ =
                 (float)((uint)bVar17 * (int)fVar136 | (uint)!bVar17 * auVar101._24_4_);
            bVar17 = SUB81(uVar66 >> 7,0);
            local_2c0._28_4_ =
                 (float)((uint)bVar17 * auVar105._28_4_ | (uint)!bVar17 * auVar101._28_4_);
            auVar101 = vsubps_avx(ZEXT1632(auVar11),auVar87);
            auVar81 = vfmadd213ps_fma(auVar101,local_2c0,auVar87);
            uVar153 = *(undefined4 *)((long)local_540->ray_space + k * 4 + -0x10);
            auVar26._4_4_ = uVar153;
            auVar26._0_4_ = uVar153;
            auVar26._8_4_ = uVar153;
            auVar26._12_4_ = uVar153;
            auVar26._16_4_ = uVar153;
            auVar26._20_4_ = uVar153;
            auVar26._24_4_ = uVar153;
            auVar26._28_4_ = uVar153;
            auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                          CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                   CONCAT44(auVar81._4_4_ +
                                                                            auVar81._4_4_,
                                                                            auVar81._0_4_ +
                                                                            auVar81._0_4_)))),
                                       auVar26);
            uVar77 = vcmpps_avx512vl(_local_4c0,auVar101,6);
            uVar75 = uVar75 & uVar77;
            bVar74 = (byte)uVar75;
            if (bVar74 != 0) {
              auVar163._0_4_ = auVar106._0_4_ * fVar188;
              auVar163._4_4_ = auVar106._4_4_ * fVar190;
              auVar163._8_4_ = auVar106._8_4_ * fVar191;
              auVar163._12_4_ = auVar106._12_4_ * fVar165;
              auVar163._16_4_ = auVar106._16_4_ * 0.0;
              auVar163._20_4_ = auVar106._20_4_ * 0.0;
              auVar163._24_4_ = auVar106._24_4_ * 0.0;
              auVar163._28_4_ = 0;
              auVar101 = vsubps_avx512vl(auVar103,auVar163);
              auVar119._0_4_ =
                   (uint)(bVar65 & 1) * (int)auVar163._0_4_ |
                   (uint)!(bool)(bVar65 & 1) * auVar101._0_4_;
              bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
              auVar119._4_4_ = (uint)bVar17 * (int)auVar163._4_4_ | (uint)!bVar17 * auVar101._4_4_;
              bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
              auVar119._8_4_ = (uint)bVar17 * (int)auVar163._8_4_ | (uint)!bVar17 * auVar101._8_4_;
              bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
              auVar119._12_4_ =
                   (uint)bVar17 * (int)auVar163._12_4_ | (uint)!bVar17 * auVar101._12_4_;
              bVar17 = (bool)((byte)(uVar66 >> 4) & 1);
              auVar119._16_4_ =
                   (uint)bVar17 * (int)auVar163._16_4_ | (uint)!bVar17 * auVar101._16_4_;
              bVar17 = (bool)((byte)(uVar66 >> 5) & 1);
              auVar119._20_4_ =
                   (uint)bVar17 * (int)auVar163._20_4_ | (uint)!bVar17 * auVar101._20_4_;
              bVar17 = (bool)((byte)(uVar66 >> 6) & 1);
              auVar119._24_4_ =
                   (uint)bVar17 * (int)auVar163._24_4_ | (uint)!bVar17 * auVar101._24_4_;
              auVar119._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar101._28_4_;
              auVar27._8_4_ = 0x40000000;
              auVar27._0_8_ = 0x4000000040000000;
              auVar27._12_4_ = 0x40000000;
              auVar27._16_4_ = 0x40000000;
              auVar27._20_4_ = 0x40000000;
              auVar27._24_4_ = 0x40000000;
              auVar27._28_4_ = 0x40000000;
              local_2a0 = vfmsub132ps_avx512vl(auVar119,auVar103,auVar27);
              local_280 = _local_4c0;
              local_260 = 0;
              local_25c = iVar12;
              local_250 = local_5a0._0_8_;
              uStack_248 = local_5a0._8_8_;
              local_240 = local_5b0._0_8_;
              uStack_238 = local_5b0._8_8_;
              local_230 = local_5c0._0_8_;
              uStack_228 = local_5c0._8_8_;
              local_220 = local_5d0;
              uStack_218 = uStack_5c8;
              if ((pGVar71->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar158 = 1.0 / auVar88._0_4_;
                local_200[0] = fVar158 * (local_2c0._0_4_ + 0.0);
                local_200[1] = fVar158 * (local_2c0._4_4_ + 1.0);
                local_200[2] = fVar158 * (local_2c0._8_4_ + 2.0);
                local_200[3] = fVar158 * (local_2c0._12_4_ + 3.0);
                fStack_1f0 = fVar158 * (local_2c0._16_4_ + 4.0);
                fStack_1ec = fVar158 * (local_2c0._20_4_ + 5.0);
                fStack_1e8 = fVar158 * (local_2c0._24_4_ + 6.0);
                fStack_1e4 = local_2c0._28_4_ + 7.0;
                local_1e0 = local_2a0;
                local_1c0 = _local_4c0;
                auVar147._8_4_ = 0x7f800000;
                auVar147._0_8_ = 0x7f8000007f800000;
                auVar147._12_4_ = 0x7f800000;
                auVar147._16_4_ = 0x7f800000;
                auVar147._20_4_ = 0x7f800000;
                auVar147._24_4_ = 0x7f800000;
                auVar147._28_4_ = 0x7f800000;
                auVar101 = vblendmps_avx512vl(auVar147,_local_4c0);
                auVar120._0_4_ =
                     (uint)(bVar74 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
                bVar17 = (bool)((byte)(uVar75 >> 1) & 1);
                auVar120._4_4_ = (uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = (bool)((byte)(uVar75 >> 2) & 1);
                auVar120._8_4_ = (uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = (bool)((byte)(uVar75 >> 3) & 1);
                auVar120._12_4_ = (uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = (bool)((byte)(uVar75 >> 4) & 1);
                auVar120._16_4_ = (uint)bVar17 * auVar101._16_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
                auVar120._20_4_ = (uint)bVar17 * auVar101._20_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = (bool)((byte)(uVar75 >> 6) & 1);
                auVar120._24_4_ = (uint)bVar17 * auVar101._24_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = SUB81(uVar75 >> 7,0);
                auVar120._28_4_ = (uint)bVar17 * auVar101._28_4_ | (uint)!bVar17 * 0x7f800000;
                auVar101 = vshufps_avx(auVar120,auVar120,0xb1);
                auVar101 = vminps_avx(auVar120,auVar101);
                auVar104 = vshufpd_avx(auVar101,auVar101,5);
                auVar101 = vminps_avx(auVar101,auVar104);
                auVar104 = vpermpd_avx2(auVar101,0x4e);
                auVar101 = vminps_avx(auVar101,auVar104);
                uVar154 = vcmpps_avx512vl(auVar120,auVar101,0);
                uVar67 = (uint)uVar75;
                if ((bVar74 & (byte)uVar154) != 0) {
                  uVar67 = (uint)(bVar74 & (byte)uVar154);
                }
                uVar24 = 0;
                for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
                  uVar24 = uVar24 + 1;
                }
                uVar66 = (ulong)uVar24;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar71->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_4a0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  do {
                    local_420 = local_200[uVar66];
                    local_410 = *(undefined4 *)(local_1e0 + uVar66 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar66 * 4);
                    local_590.context = context->user;
                    fVar188 = 1.0 - local_420;
                    fVar158 = fVar188 * fVar188 * -3.0;
                    auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar188 * fVar188)),
                                              ZEXT416((uint)(local_420 * fVar188)),
                                              ZEXT416(0xc0000000));
                    auVar80 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar188)),
                                              ZEXT416((uint)(local_420 * local_420)),
                                              ZEXT416(0x40000000));
                    fVar188 = auVar81._0_4_ * 3.0;
                    fVar190 = auVar80._0_4_ * 3.0;
                    fVar191 = local_420 * local_420 * 3.0;
                    auVar183._0_4_ = fVar191 * (float)local_5d0._0_4_;
                    auVar183._4_4_ = fVar191 * (float)local_5d0._4_4_;
                    auVar183._8_4_ = fVar191 * (float)uStack_5c8;
                    auVar183._12_4_ = fVar191 * uStack_5c8._4_4_;
                    auVar184 = ZEXT1664(auVar183);
                    auVar144._4_4_ = fVar190;
                    auVar144._0_4_ = fVar190;
                    auVar144._8_4_ = fVar190;
                    auVar144._12_4_ = fVar190;
                    auVar81 = vfmadd132ps_fma(auVar144,auVar183,local_5c0);
                    auVar172._4_4_ = fVar188;
                    auVar172._0_4_ = fVar188;
                    auVar172._8_4_ = fVar188;
                    auVar172._12_4_ = fVar188;
                    auVar81 = vfmadd132ps_fma(auVar172,auVar81,local_5b0);
                    auVar145._4_4_ = fVar158;
                    auVar145._0_4_ = fVar158;
                    auVar145._8_4_ = fVar158;
                    auVar145._12_4_ = fVar158;
                    auVar81 = vfmadd132ps_fma(auVar145,auVar81,local_5a0);
                    local_450 = auVar81._0_4_;
                    local_440 = vshufps_avx(auVar81,auVar81,0x55);
                    auVar179 = ZEXT1664(local_440);
                    local_430 = vshufps_avx(auVar81,auVar81,0xaa);
                    iStack_44c = local_450;
                    iStack_448 = local_450;
                    iStack_444 = local_450;
                    fStack_41c = local_420;
                    fStack_418 = local_420;
                    fStack_414 = local_420;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    local_400 = local_4e0._0_8_;
                    uStack_3f8 = local_4e0._8_8_;
                    local_3f0 = local_4d0;
                    vpcmpeqd_avx2(ZEXT1632(local_4d0),ZEXT1632(local_4d0));
                    uStack_3dc = (local_590.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_590.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_5f0 = local_4f0;
                    local_590.valid = (int *)local_5f0;
                    local_590.geometryUserPtr = pGVar71->userPtr;
                    local_590.hit = (RTCHitN *)&local_450;
                    local_590.N = 4;
                    local_590.ray = (RTCRayN *)ray;
                    if (pGVar71->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar179 = ZEXT1664(local_440);
                      auVar184 = ZEXT1664(auVar183);
                      (*pGVar71->intersectionFilterN)(&local_590);
                      auVar186 = ZEXT3264(_local_4c0);
                      auVar203 = ZEXT464(0xbf800000);
                      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar202 = ZEXT3264(auVar101);
                      auVar101 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar201 = ZEXT3264(auVar101);
                    }
                    uVar77 = vptestmd_avx512vl(local_5f0,local_5f0);
                    if ((uVar77 & 0xf) == 0) {
LAB_01b040f1:
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_4a0._0_4_;
                    }
                    else {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar71->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar179 = ZEXT1664(auVar179._0_16_);
                        auVar184 = ZEXT1664(auVar184._0_16_);
                        (*p_Var16)(&local_590);
                        auVar186 = ZEXT3264(_local_4c0);
                        auVar203 = ZEXT464(0xbf800000);
                        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar202 = ZEXT3264(auVar101);
                        auVar101 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar201 = ZEXT3264(auVar101);
                      }
                      uVar77 = vptestmd_avx512vl(local_5f0,local_5f0);
                      uVar77 = uVar77 & 0xf;
                      bVar74 = (byte)uVar77;
                      if (bVar74 == 0) goto LAB_01b040f1;
                      iVar1 = *(int *)(local_590.hit + 4);
                      iVar2 = *(int *)(local_590.hit + 8);
                      iVar63 = *(int *)(local_590.hit + 0xc);
                      bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar19 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_590.ray + 0xc0) =
                           (uint)(bVar74 & 1) * *(int *)local_590.hit |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xc0);
                      *(uint *)(local_590.ray + 0xc4) =
                           (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xc4);
                      *(uint *)(local_590.ray + 200) =
                           (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 200);
                      *(uint *)(local_590.ray + 0xcc) =
                           (uint)bVar19 * iVar63 | (uint)!bVar19 * *(int *)(local_590.ray + 0xcc);
                      iVar1 = *(int *)(local_590.hit + 0x14);
                      iVar2 = *(int *)(local_590.hit + 0x18);
                      iVar63 = *(int *)(local_590.hit + 0x1c);
                      bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar19 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_590.ray + 0xd0) =
                           (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x10) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xd0);
                      *(uint *)(local_590.ray + 0xd4) =
                           (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xd4);
                      *(uint *)(local_590.ray + 0xd8) =
                           (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xd8);
                      *(uint *)(local_590.ray + 0xdc) =
                           (uint)bVar19 * iVar63 | (uint)!bVar19 * *(int *)(local_590.ray + 0xdc);
                      iVar1 = *(int *)(local_590.hit + 0x24);
                      iVar2 = *(int *)(local_590.hit + 0x28);
                      iVar63 = *(int *)(local_590.hit + 0x2c);
                      bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar19 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_590.ray + 0xe0) =
                           (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x20) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xe0);
                      *(uint *)(local_590.ray + 0xe4) =
                           (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xe4);
                      *(uint *)(local_590.ray + 0xe8) =
                           (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xe8);
                      *(uint *)(local_590.ray + 0xec) =
                           (uint)bVar19 * iVar63 | (uint)!bVar19 * *(int *)(local_590.ray + 0xec);
                      iVar1 = *(int *)(local_590.hit + 0x34);
                      iVar2 = *(int *)(local_590.hit + 0x38);
                      iVar63 = *(int *)(local_590.hit + 0x3c);
                      bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar19 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_590.ray + 0xf0) =
                           (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x30) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xf0);
                      *(uint *)(local_590.ray + 0xf4) =
                           (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xf4);
                      *(uint *)(local_590.ray + 0xf8) =
                           (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xf8);
                      *(uint *)(local_590.ray + 0xfc) =
                           (uint)bVar19 * iVar63 | (uint)!bVar19 * *(int *)(local_590.ray + 0xfc);
                      iVar1 = *(int *)(local_590.hit + 0x44);
                      iVar2 = *(int *)(local_590.hit + 0x48);
                      iVar63 = *(int *)(local_590.hit + 0x4c);
                      bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar19 = SUB81(uVar77 >> 3,0);
                      *(uint *)(local_590.ray + 0x100) =
                           (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x40) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0x100);
                      *(uint *)(local_590.ray + 0x104) =
                           (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0x104);
                      *(uint *)(local_590.ray + 0x108) =
                           (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0x108);
                      *(uint *)(local_590.ray + 0x10c) =
                           (uint)bVar19 * iVar63 | (uint)!bVar19 * *(int *)(local_590.ray + 0x10c);
                      auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50));
                      *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar81;
                      auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60));
                      *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar81;
                      auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70));
                      *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar81;
                      auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80));
                      *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar81;
                      local_4a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_4a0._4_4_ = 0;
                      local_4a0._8_4_ = 0;
                      local_4a0._12_4_ = 0;
                    }
                    bVar74 = ~(byte)(1 << ((uint)uVar66 & 0x1f)) & (byte)uVar75;
                    auVar151._4_4_ = local_4a0._0_4_;
                    auVar151._0_4_ = local_4a0._0_4_;
                    auVar151._8_4_ = local_4a0._0_4_;
                    auVar151._12_4_ = local_4a0._0_4_;
                    auVar151._16_4_ = local_4a0._0_4_;
                    auVar151._20_4_ = local_4a0._0_4_;
                    auVar151._24_4_ = local_4a0._0_4_;
                    auVar151._28_4_ = local_4a0._0_4_;
                    uVar154 = vcmpps_avx512vl(auVar186._0_32_,auVar151,2);
                    if ((bVar74 & (byte)uVar154) == 0) goto LAB_01b030e3;
                    bVar74 = bVar74 & (byte)uVar154;
                    uVar75 = (ulong)bVar74;
                    auVar152._8_4_ = 0x7f800000;
                    auVar152._0_8_ = 0x7f8000007f800000;
                    auVar152._12_4_ = 0x7f800000;
                    auVar152._16_4_ = 0x7f800000;
                    auVar152._20_4_ = 0x7f800000;
                    auVar152._24_4_ = 0x7f800000;
                    auVar152._28_4_ = 0x7f800000;
                    auVar101 = vblendmps_avx512vl(auVar152,auVar186._0_32_);
                    auVar133._0_4_ =
                         (uint)(bVar74 & 1) * auVar101._0_4_ |
                         (uint)!(bool)(bVar74 & 1) * 0x7f800000;
                    bVar17 = (bool)(bVar74 >> 1 & 1);
                    auVar133._4_4_ = (uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar74 >> 2 & 1);
                    auVar133._8_4_ = (uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar74 >> 3 & 1);
                    auVar133._12_4_ = (uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar74 >> 4 & 1);
                    auVar133._16_4_ = (uint)bVar17 * auVar101._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar74 >> 5 & 1);
                    auVar133._20_4_ = (uint)bVar17 * auVar101._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar74 >> 6 & 1);
                    auVar133._24_4_ = (uint)bVar17 * auVar101._24_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar133._28_4_ =
                         (uint)(bVar74 >> 7) * auVar101._28_4_ |
                         (uint)!(bool)(bVar74 >> 7) * 0x7f800000;
                    auVar101 = vshufps_avx(auVar133,auVar133,0xb1);
                    auVar101 = vminps_avx(auVar133,auVar101);
                    auVar104 = vshufpd_avx(auVar101,auVar101,5);
                    auVar101 = vminps_avx(auVar101,auVar104);
                    auVar104 = vpermpd_avx2(auVar101,0x4e);
                    auVar101 = vminps_avx(auVar101,auVar104);
                    uVar154 = vcmpps_avx512vl(auVar133,auVar101,0);
                    bVar65 = (byte)uVar154 & bVar74;
                    if (bVar65 != 0) {
                      bVar74 = bVar65;
                    }
                    uVar73 = 0;
                    for (uVar68 = (uint)bVar74; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000
                        ) {
                      uVar73 = uVar73 + 1;
                    }
                    uVar66 = (ulong)uVar73;
                  } while( true );
                }
                fVar158 = local_200[uVar66];
                uVar153 = *(undefined4 *)(local_1e0 + uVar66 * 4);
                fVar190 = 1.0 - fVar158;
                fVar188 = fVar190 * fVar190 * -3.0;
                auVar179 = ZEXT464((uint)fVar188);
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),
                                          ZEXT416((uint)(fVar158 * fVar190)),ZEXT416(0xc0000000));
                auVar80 = vfmsub132ss_fma(ZEXT416((uint)(fVar158 * fVar190)),
                                          ZEXT416((uint)(fVar158 * fVar158)),ZEXT416(0x40000000));
                fVar190 = auVar81._0_4_ * 3.0;
                fVar191 = auVar80._0_4_ * 3.0;
                fVar165 = fVar158 * fVar158 * 3.0;
                auVar180._0_4_ = fVar165 * (float)local_5d0._0_4_;
                auVar180._4_4_ = fVar165 * (float)local_5d0._4_4_;
                auVar180._8_4_ = fVar165 * (float)uStack_5c8;
                auVar180._12_4_ = fVar165 * uStack_5c8._4_4_;
                auVar184 = ZEXT1664(auVar180);
                auVar159._4_4_ = fVar191;
                auVar159._0_4_ = fVar191;
                auVar159._8_4_ = fVar191;
                auVar159._12_4_ = fVar191;
                auVar81 = vfmadd132ps_fma(auVar159,auVar180,local_5c0);
                auVar169._4_4_ = fVar190;
                auVar169._0_4_ = fVar190;
                auVar169._8_4_ = fVar190;
                auVar169._12_4_ = fVar190;
                auVar81 = vfmadd132ps_fma(auVar169,auVar81,local_5b0);
                auVar160._4_4_ = fVar188;
                auVar160._0_4_ = fVar188;
                auVar160._8_4_ = fVar188;
                auVar160._12_4_ = fVar188;
                auVar81 = vfmadd132ps_fma(auVar160,auVar81,local_5a0);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar66 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar81._0_4_;
                uVar13 = vextractps_avx(auVar81,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                uVar13 = vextractps_avx(auVar81,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar13;
                *(float *)(ray + k * 4 + 0xf0) = fVar158;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar153;
                *(uint *)(ray + k * 4 + 0x110) = uVar68;
                *(uint *)(ray + k * 4 + 0x120) = uVar73;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_01b030e3:
                prim = local_5e0;
                fVar158 = (float)local_560._0_4_;
              }
            }
          }
        }
      }
    }
    local_560._0_4_ = fVar158;
    if (8 < iVar12) {
      local_4a0 = vpbroadcastd_avx512vl();
      local_4c0._4_4_ = local_560._0_4_;
      local_4c0._0_4_ = local_560._0_4_;
      fStack_4b8 = (float)local_560._0_4_;
      fStack_4b4 = (float)local_560._0_4_;
      fStack_4b0 = (float)local_560._0_4_;
      fStack_4ac = (float)local_560._0_4_;
      fStack_4a8 = (float)local_560._0_4_;
      fStack_4a4 = (float)local_560._0_4_;
      uStack_47c = local_480;
      uStack_478 = local_480;
      uStack_474 = local_480;
      uStack_470 = local_480;
      uStack_46c = local_480;
      uStack_468 = local_480;
      uStack_464 = local_480;
      local_120 = 1.0 / (float)local_520._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      lVar69 = 8;
LAB_01b03189:
      if (lVar69 < iVar12) {
        auVar101 = vpbroadcastd_avx512vl();
        auVar101 = vpor_avx2(auVar101,_DAT_01fb4ba0);
        uVar23 = vpcmpd_avx512vl(auVar101,local_4a0,1);
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 * 4 + lVar72);
        auVar104 = *(undefined1 (*) [32])(lVar72 + 0x21fb768 + lVar69 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar72 + 0x21fbbec + lVar69 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar72 + 0x21fc070 + lVar69 * 4);
        auVar185._0_4_ = auVar102._0_4_ * (float)local_3a0._0_4_;
        auVar185._4_4_ = auVar102._4_4_ * (float)local_3a0._4_4_;
        auVar185._8_4_ = auVar102._8_4_ * fStack_398;
        auVar185._12_4_ = auVar102._12_4_ * fStack_394;
        auVar185._16_4_ = auVar102._16_4_ * fStack_390;
        auVar185._20_4_ = auVar102._20_4_ * fStack_38c;
        auVar185._28_36_ = auVar184._28_36_;
        auVar185._24_4_ = auVar102._24_4_ * fStack_388;
        auVar184._0_4_ = auVar102._0_4_ * (float)local_3c0._0_4_;
        auVar184._4_4_ = auVar102._4_4_ * (float)local_3c0._4_4_;
        auVar184._8_4_ = auVar102._8_4_ * fStack_3b8;
        auVar184._12_4_ = auVar102._12_4_ * fStack_3b4;
        auVar184._16_4_ = auVar102._16_4_ * fStack_3b0;
        auVar184._20_4_ = auVar102._20_4_ * fStack_3ac;
        auVar184._28_36_ = auVar179._28_36_;
        auVar184._24_4_ = auVar102._24_4_ * fStack_3a8;
        auVar98 = vmulps_avx512vl(local_100,auVar102);
        auVar99 = vfmadd231ps_avx512vl(auVar185._0_32_,auVar103,local_360);
        auVar100 = vfmadd231ps_avx512vl(auVar184._0_32_,auVar103,local_380);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_e0);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_320);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,local_340);
        auVar93 = vfmadd231ps_avx512vl(auVar98,auVar104,local_c0);
        auVar81 = vfmadd231ps_fma(auVar99,auVar101,local_2e0);
        auVar184 = ZEXT1664(auVar81);
        auVar80 = vfmadd231ps_fma(auVar100,auVar101,local_300);
        auVar179 = ZEXT1664(auVar80);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 * 4 + lVar72);
        auVar99 = *(undefined1 (*) [32])(lVar72 + 0x21fdb88 + lVar69 * 4);
        auVar106 = vfmadd231ps_avx512vl(auVar93,auVar101,local_a0);
        auVar100 = *(undefined1 (*) [32])(lVar72 + 0x21fe00c + lVar69 * 4);
        auVar93 = *(undefined1 (*) [32])(lVar72 + 0x21fe490 + lVar69 * 4);
        auVar187._0_4_ = auVar93._0_4_ * (float)local_3a0._0_4_;
        auVar187._4_4_ = auVar93._4_4_ * (float)local_3a0._4_4_;
        auVar187._8_4_ = auVar93._8_4_ * fStack_398;
        auVar187._12_4_ = auVar93._12_4_ * fStack_394;
        auVar187._16_4_ = auVar93._16_4_ * fStack_390;
        auVar187._20_4_ = auVar93._20_4_ * fStack_38c;
        auVar187._28_36_ = auVar186._28_36_;
        auVar187._24_4_ = auVar93._24_4_ * fStack_388;
        auVar46._4_4_ = auVar93._4_4_ * (float)local_3c0._4_4_;
        auVar46._0_4_ = auVar93._0_4_ * (float)local_3c0._0_4_;
        auVar46._8_4_ = auVar93._8_4_ * fStack_3b8;
        auVar46._12_4_ = auVar93._12_4_ * fStack_3b4;
        auVar46._16_4_ = auVar93._16_4_ * fStack_3b0;
        auVar46._20_4_ = auVar93._20_4_ * fStack_3ac;
        auVar46._24_4_ = auVar93._24_4_ * fStack_3a8;
        auVar46._28_4_ = uStack_3a4;
        auVar94 = vmulps_avx512vl(local_100,auVar93);
        auVar105 = vfmadd231ps_avx512vl(auVar187._0_32_,auVar100,local_360);
        auVar107 = vfmadd231ps_avx512vl(auVar46,auVar100,local_380);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_e0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar99,local_320);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar99,local_340);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,local_c0);
        auVar82 = vfmadd231ps_fma(auVar105,auVar98,local_2e0);
        auVar186 = ZEXT1664(auVar82);
        auVar6 = vfmadd231ps_fma(auVar107,auVar98,local_300);
        auVar107 = vfmadd231ps_avx512vl(auVar94,auVar98,local_a0);
        auVar108 = vmaxps_avx512vl(auVar106,auVar107);
        auVar94 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar81));
        auVar105 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar80));
        auVar87 = vmulps_avx512vl(ZEXT1632(auVar80),auVar94);
        auVar88 = vmulps_avx512vl(ZEXT1632(auVar81),auVar105);
        auVar87 = vsubps_avx512vl(auVar87,auVar88);
        auVar88 = vmulps_avx512vl(auVar105,auVar105);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar94,auVar94);
        auVar108 = vmulps_avx512vl(auVar108,auVar108);
        auVar108 = vmulps_avx512vl(auVar108,auVar88);
        auVar87 = vmulps_avx512vl(auVar87,auVar87);
        uVar154 = vcmpps_avx512vl(auVar87,auVar108,2);
        bVar74 = (byte)uVar23 & (byte)uVar154;
        if (bVar74 != 0) {
          auVar93 = vmulps_avx512vl(local_1a0,auVar93);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_180,auVar93);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_160,auVar100);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar99);
          auVar102 = vmulps_avx512vl(local_1a0,auVar102);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_180,auVar102);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_160,auVar103);
          auVar99 = vfmadd213ps_avx512vl(auVar101,local_140,auVar104);
          auVar101 = *(undefined1 (*) [32])(lVar72 + 0x21fc4f4 + lVar69 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar72 + 0x21fc978 + lVar69 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar72 + 0x21fcdfc + lVar69 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar72 + 0x21fd280 + lVar69 * 4);
          auVar100 = vmulps_avx512vl(_local_3a0,auVar102);
          auVar93 = vmulps_avx512vl(_local_3c0,auVar102);
          auVar102 = vmulps_avx512vl(local_1a0,auVar102);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,local_360);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar103,local_380);
          auVar103 = vfmadd231ps_avx512vl(auVar102,local_180,auVar103);
          auVar102 = vfmadd231ps_avx512vl(auVar100,auVar104,local_320);
          auVar100 = vfmadd231ps_avx512vl(auVar93,auVar104,local_340);
          auVar104 = vfmadd231ps_avx512vl(auVar103,local_160,auVar104);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar101,local_2e0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar101,local_300);
          auVar93 = vfmadd231ps_avx512vl(auVar104,local_140,auVar101);
          auVar101 = *(undefined1 (*) [32])(lVar72 + 0x21fe914 + lVar69 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar72 + 0x21ff21c + lVar69 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar72 + 0x21ff6a0 + lVar69 * 4);
          auVar108 = vmulps_avx512vl(_local_3a0,auVar103);
          auVar87 = vmulps_avx512vl(_local_3c0,auVar103);
          auVar103 = vmulps_avx512vl(local_1a0,auVar103);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,local_360);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar104,local_380);
          auVar103 = vfmadd231ps_avx512vl(auVar103,local_180,auVar104);
          auVar104 = *(undefined1 (*) [32])(lVar72 + 0x21fed98 + lVar69 * 4);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,local_320);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar104,local_340);
          auVar104 = vfmadd231ps_avx512vl(auVar103,local_160,auVar104);
          auVar203 = ZEXT1664(auVar203._0_16_);
          auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar201 = ZEXT3264(auVar103);
          auVar103 = vfmadd231ps_avx512vl(auVar108,auVar101,local_2e0);
          auVar108 = vfmadd231ps_avx512vl(auVar87,auVar101,local_300);
          auVar104 = vfmadd231ps_avx512vl(auVar104,local_140,auVar101);
          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar102,auVar87);
          vandps_avx512vl(auVar100,auVar87);
          auVar101 = vmaxps_avx(auVar87,auVar87);
          vandps_avx512vl(auVar93,auVar87);
          auVar101 = vmaxps_avx(auVar101,auVar87);
          uVar66 = vcmpps_avx512vl(auVar101,_local_4c0,1);
          bVar17 = (bool)((byte)uVar66 & 1);
          auVar121._0_4_ = (float)((uint)bVar17 * auVar94._0_4_ | (uint)!bVar17 * auVar102._0_4_);
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar17 * auVar94._4_4_ | (uint)!bVar17 * auVar102._4_4_);
          bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar17 * auVar94._8_4_ | (uint)!bVar17 * auVar102._8_4_);
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar17 * auVar94._12_4_ | (uint)!bVar17 * auVar102._12_4_)
          ;
          bVar17 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar17 * auVar94._16_4_ | (uint)!bVar17 * auVar102._16_4_)
          ;
          bVar17 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar17 * auVar94._20_4_ | (uint)!bVar17 * auVar102._20_4_)
          ;
          bVar17 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar17 * auVar94._24_4_ | (uint)!bVar17 * auVar102._24_4_)
          ;
          bVar17 = SUB81(uVar66 >> 7,0);
          auVar121._28_4_ = (uint)bVar17 * auVar94._28_4_ | (uint)!bVar17 * auVar102._28_4_;
          bVar17 = (bool)((byte)uVar66 & 1);
          auVar122._0_4_ = (float)((uint)bVar17 * auVar105._0_4_ | (uint)!bVar17 * auVar100._0_4_);
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * auVar100._4_4_);
          bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * auVar100._8_4_);
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar122._12_4_ =
               (float)((uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * auVar100._12_4_);
          bVar17 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar122._16_4_ =
               (float)((uint)bVar17 * auVar105._16_4_ | (uint)!bVar17 * auVar100._16_4_);
          bVar17 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar122._20_4_ =
               (float)((uint)bVar17 * auVar105._20_4_ | (uint)!bVar17 * auVar100._20_4_);
          bVar17 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar122._24_4_ =
               (float)((uint)bVar17 * auVar105._24_4_ | (uint)!bVar17 * auVar100._24_4_);
          bVar17 = SUB81(uVar66 >> 7,0);
          auVar122._28_4_ = (uint)bVar17 * auVar105._28_4_ | (uint)!bVar17 * auVar100._28_4_;
          vandps_avx512vl(auVar103,auVar87);
          vandps_avx512vl(auVar108,auVar87);
          auVar101 = vmaxps_avx(auVar122,auVar122);
          vandps_avx512vl(auVar104,auVar87);
          auVar101 = vmaxps_avx(auVar101,auVar122);
          uVar66 = vcmpps_avx512vl(auVar101,_local_4c0,1);
          bVar17 = (bool)((byte)uVar66 & 1);
          auVar123._0_4_ = (uint)bVar17 * auVar94._0_4_ | (uint)!bVar17 * auVar103._0_4_;
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar17 * auVar94._4_4_ | (uint)!bVar17 * auVar103._4_4_;
          bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar17 * auVar94._8_4_ | (uint)!bVar17 * auVar103._8_4_;
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar17 * auVar94._12_4_ | (uint)!bVar17 * auVar103._12_4_;
          bVar17 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar123._16_4_ = (uint)bVar17 * auVar94._16_4_ | (uint)!bVar17 * auVar103._16_4_;
          bVar17 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar123._20_4_ = (uint)bVar17 * auVar94._20_4_ | (uint)!bVar17 * auVar103._20_4_;
          bVar17 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar123._24_4_ = (uint)bVar17 * auVar94._24_4_ | (uint)!bVar17 * auVar103._24_4_;
          bVar17 = SUB81(uVar66 >> 7,0);
          auVar123._28_4_ = (uint)bVar17 * auVar94._28_4_ | (uint)!bVar17 * auVar103._28_4_;
          bVar17 = (bool)((byte)uVar66 & 1);
          auVar124._0_4_ = (float)((uint)bVar17 * auVar105._0_4_ | (uint)!bVar17 * auVar108._0_4_);
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * auVar108._4_4_);
          bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * auVar108._8_4_);
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar124._12_4_ =
               (float)((uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * auVar108._12_4_);
          bVar17 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar124._16_4_ =
               (float)((uint)bVar17 * auVar105._16_4_ | (uint)!bVar17 * auVar108._16_4_);
          bVar17 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar124._20_4_ =
               (float)((uint)bVar17 * auVar105._20_4_ | (uint)!bVar17 * auVar108._20_4_);
          bVar17 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar124._24_4_ =
               (float)((uint)bVar17 * auVar105._24_4_ | (uint)!bVar17 * auVar108._24_4_);
          bVar17 = SUB81(uVar66 >> 7,0);
          auVar124._28_4_ = (uint)bVar17 * auVar105._28_4_ | (uint)!bVar17 * auVar108._28_4_;
          auVar193._8_4_ = 0x80000000;
          auVar193._0_8_ = 0x8000000080000000;
          auVar193._12_4_ = 0x80000000;
          auVar193._16_4_ = 0x80000000;
          auVar193._20_4_ = 0x80000000;
          auVar193._24_4_ = 0x80000000;
          auVar193._28_4_ = 0x80000000;
          auVar101 = vxorps_avx512vl(auVar123,auVar193);
          auVar86 = vxorps_avx512vl(auVar87._0_16_,auVar87._0_16_);
          auVar104 = vfmadd213ps_avx512vl(auVar121,auVar121,ZEXT1632(auVar86));
          auVar7 = vfmadd231ps_fma(auVar104,auVar122,auVar122);
          auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar7));
          auVar200._8_4_ = 0xbf000000;
          auVar200._0_8_ = 0xbf000000bf000000;
          auVar200._12_4_ = 0xbf000000;
          auVar200._16_4_ = 0xbf000000;
          auVar200._20_4_ = 0xbf000000;
          auVar200._24_4_ = 0xbf000000;
          auVar200._28_4_ = 0xbf000000;
          fVar158 = auVar104._0_4_;
          fVar188 = auVar104._4_4_;
          fVar190 = auVar104._8_4_;
          fVar191 = auVar104._12_4_;
          fVar165 = auVar104._16_4_;
          fVar157 = auVar104._20_4_;
          fVar164 = auVar104._24_4_;
          auVar47._4_4_ = fVar188 * fVar188 * fVar188 * auVar7._4_4_ * -0.5;
          auVar47._0_4_ = fVar158 * fVar158 * fVar158 * auVar7._0_4_ * -0.5;
          auVar47._8_4_ = fVar190 * fVar190 * fVar190 * auVar7._8_4_ * -0.5;
          auVar47._12_4_ = fVar191 * fVar191 * fVar191 * auVar7._12_4_ * -0.5;
          auVar47._16_4_ = fVar165 * fVar165 * fVar165 * -0.0;
          auVar47._20_4_ = fVar157 * fVar157 * fVar157 * -0.0;
          auVar47._24_4_ = fVar164 * fVar164 * fVar164 * -0.0;
          auVar47._28_4_ = auVar122._28_4_;
          auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar104 = vfmadd231ps_avx512vl(auVar47,auVar103,auVar104);
          auVar48._4_4_ = auVar122._4_4_ * auVar104._4_4_;
          auVar48._0_4_ = auVar122._0_4_ * auVar104._0_4_;
          auVar48._8_4_ = auVar122._8_4_ * auVar104._8_4_;
          auVar48._12_4_ = auVar122._12_4_ * auVar104._12_4_;
          auVar48._16_4_ = auVar122._16_4_ * auVar104._16_4_;
          auVar48._20_4_ = auVar122._20_4_ * auVar104._20_4_;
          auVar48._24_4_ = auVar122._24_4_ * auVar104._24_4_;
          auVar48._28_4_ = 0;
          auVar49._4_4_ = auVar104._4_4_ * -auVar121._4_4_;
          auVar49._0_4_ = auVar104._0_4_ * -auVar121._0_4_;
          auVar49._8_4_ = auVar104._8_4_ * -auVar121._8_4_;
          auVar49._12_4_ = auVar104._12_4_ * -auVar121._12_4_;
          auVar49._16_4_ = auVar104._16_4_ * -auVar121._16_4_;
          auVar49._20_4_ = auVar104._20_4_ * -auVar121._20_4_;
          auVar49._24_4_ = auVar104._24_4_ * -auVar121._24_4_;
          auVar49._28_4_ = auVar122._28_4_;
          auVar102 = vmulps_avx512vl(auVar104,ZEXT1632(auVar86));
          auVar93 = ZEXT1632(auVar86);
          auVar104 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar93);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar124,auVar124);
          auVar100 = vrsqrt14ps_avx512vl(auVar104);
          auVar104 = vmulps_avx512vl(auVar104,auVar200);
          fVar158 = auVar100._0_4_;
          fVar188 = auVar100._4_4_;
          fVar190 = auVar100._8_4_;
          fVar191 = auVar100._12_4_;
          fVar165 = auVar100._16_4_;
          fVar157 = auVar100._20_4_;
          fVar164 = auVar100._24_4_;
          auVar50._4_4_ = fVar188 * fVar188 * fVar188 * auVar104._4_4_;
          auVar50._0_4_ = fVar158 * fVar158 * fVar158 * auVar104._0_4_;
          auVar50._8_4_ = fVar190 * fVar190 * fVar190 * auVar104._8_4_;
          auVar50._12_4_ = fVar191 * fVar191 * fVar191 * auVar104._12_4_;
          auVar50._16_4_ = fVar165 * fVar165 * fVar165 * auVar104._16_4_;
          auVar50._20_4_ = fVar157 * fVar157 * fVar157 * auVar104._20_4_;
          auVar50._24_4_ = fVar164 * fVar164 * fVar164 * auVar104._24_4_;
          auVar50._28_4_ = auVar104._28_4_;
          auVar104 = vfmadd231ps_avx512vl(auVar50,auVar103,auVar100);
          auVar51._4_4_ = auVar124._4_4_ * auVar104._4_4_;
          auVar51._0_4_ = auVar124._0_4_ * auVar104._0_4_;
          auVar51._8_4_ = auVar124._8_4_ * auVar104._8_4_;
          auVar51._12_4_ = auVar124._12_4_ * auVar104._12_4_;
          auVar51._16_4_ = auVar124._16_4_ * auVar104._16_4_;
          auVar51._20_4_ = auVar124._20_4_ * auVar104._20_4_;
          auVar51._24_4_ = auVar124._24_4_ * auVar104._24_4_;
          auVar51._28_4_ = auVar100._28_4_;
          auVar52._4_4_ = auVar104._4_4_ * auVar101._4_4_;
          auVar52._0_4_ = auVar104._0_4_ * auVar101._0_4_;
          auVar52._8_4_ = auVar104._8_4_ * auVar101._8_4_;
          auVar52._12_4_ = auVar104._12_4_ * auVar101._12_4_;
          auVar52._16_4_ = auVar104._16_4_ * auVar101._16_4_;
          auVar52._20_4_ = auVar104._20_4_ * auVar101._20_4_;
          auVar52._24_4_ = auVar104._24_4_ * auVar101._24_4_;
          auVar52._28_4_ = auVar101._28_4_;
          auVar101 = vmulps_avx512vl(auVar104,auVar93);
          auVar7 = vfmadd213ps_fma(auVar48,auVar106,ZEXT1632(auVar81));
          auVar8 = vfmadd213ps_fma(auVar49,auVar106,ZEXT1632(auVar80));
          auVar103 = vfmadd213ps_avx512vl(auVar102,auVar106,auVar99);
          auVar100 = vfmadd213ps_avx512vl(auVar51,auVar107,ZEXT1632(auVar82));
          auVar10 = vfnmadd213ps_fma(auVar48,auVar106,ZEXT1632(auVar81));
          auVar81 = vfmadd213ps_fma(auVar52,auVar107,ZEXT1632(auVar6));
          auVar11 = vfnmadd213ps_fma(auVar49,auVar106,ZEXT1632(auVar80));
          auVar80 = vfmadd213ps_fma(auVar101,auVar107,auVar98);
          auVar155 = vfnmadd231ps_fma(auVar99,auVar106,auVar102);
          auVar83 = vfnmadd213ps_fma(auVar51,auVar107,ZEXT1632(auVar82));
          auVar84 = vfnmadd213ps_fma(auVar52,auVar107,ZEXT1632(auVar6));
          auVar85 = vfnmadd231ps_fma(auVar98,auVar107,auVar101);
          auVar98 = vsubps_avx512vl(auVar100,ZEXT1632(auVar10));
          auVar101 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar11));
          auVar104 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar155));
          auVar53._4_4_ = auVar101._4_4_ * auVar155._4_4_;
          auVar53._0_4_ = auVar101._0_4_ * auVar155._0_4_;
          auVar53._8_4_ = auVar101._8_4_ * auVar155._8_4_;
          auVar53._12_4_ = auVar101._12_4_ * auVar155._12_4_;
          auVar53._16_4_ = auVar101._16_4_ * 0.0;
          auVar53._20_4_ = auVar101._20_4_ * 0.0;
          auVar53._24_4_ = auVar101._24_4_ * 0.0;
          auVar53._28_4_ = auVar102._28_4_;
          auVar82 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar11),auVar104);
          auVar54._4_4_ = auVar104._4_4_ * auVar10._4_4_;
          auVar54._0_4_ = auVar104._0_4_ * auVar10._0_4_;
          auVar54._8_4_ = auVar104._8_4_ * auVar10._8_4_;
          auVar54._12_4_ = auVar104._12_4_ * auVar10._12_4_;
          auVar54._16_4_ = auVar104._16_4_ * 0.0;
          auVar54._20_4_ = auVar104._20_4_ * 0.0;
          auVar54._24_4_ = auVar104._24_4_ * 0.0;
          auVar54._28_4_ = auVar104._28_4_;
          auVar6 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar155),auVar98);
          auVar55._4_4_ = auVar11._4_4_ * auVar98._4_4_;
          auVar55._0_4_ = auVar11._0_4_ * auVar98._0_4_;
          auVar55._8_4_ = auVar11._8_4_ * auVar98._8_4_;
          auVar55._12_4_ = auVar11._12_4_ * auVar98._12_4_;
          auVar55._16_4_ = auVar98._16_4_ * 0.0;
          auVar55._20_4_ = auVar98._20_4_ * 0.0;
          auVar55._24_4_ = auVar98._24_4_ * 0.0;
          auVar55._28_4_ = auVar98._28_4_;
          auVar9 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar10),auVar101);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar93,ZEXT1632(auVar6));
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,ZEXT1632(auVar82));
          auVar87 = ZEXT1632(auVar86);
          uVar66 = vcmpps_avx512vl(auVar101,auVar87,2);
          bVar65 = (byte)uVar66;
          fVar134 = (float)((uint)(bVar65 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar65 & 1) * auVar83._0_4_);
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          fVar136 = (float)((uint)bVar17 * auVar7._4_4_ | (uint)!bVar17 * auVar83._4_4_);
          bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
          fVar138 = (float)((uint)bVar17 * auVar7._8_4_ | (uint)!bVar17 * auVar83._8_4_);
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          fVar140 = (float)((uint)bVar17 * auVar7._12_4_ | (uint)!bVar17 * auVar83._12_4_);
          auVar93 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar138,CONCAT44(fVar136,fVar134))));
          fVar135 = (float)((uint)(bVar65 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar65 & 1) * auVar84._0_4_);
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          fVar137 = (float)((uint)bVar17 * auVar8._4_4_ | (uint)!bVar17 * auVar84._4_4_);
          bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
          fVar139 = (float)((uint)bVar17 * auVar8._8_4_ | (uint)!bVar17 * auVar84._8_4_);
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          fVar141 = (float)((uint)bVar17 * auVar8._12_4_ | (uint)!bVar17 * auVar84._12_4_);
          auVar94 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar139,CONCAT44(fVar137,fVar135))));
          auVar125._0_4_ =
               (float)((uint)(bVar65 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar85._0_4_);
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar85._4_4_);
          bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar85._8_4_);
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar85._12_4_)
          ;
          fVar190 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar103._16_4_);
          auVar125._16_4_ = fVar190;
          fVar188 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar103._20_4_);
          auVar125._20_4_ = fVar188;
          fVar158 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar103._24_4_);
          auVar125._24_4_ = fVar158;
          iVar1 = (uint)(byte)(uVar66 >> 7) * auVar103._28_4_;
          auVar125._28_4_ = iVar1;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar100);
          auVar126._0_4_ =
               (uint)(bVar65 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar82._0_4_;
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar82._4_4_;
          bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar82._8_4_;
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar82._12_4_;
          auVar126._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar101._16_4_;
          auVar126._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar101._20_4_;
          auVar126._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar101._24_4_;
          auVar126._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar81));
          auVar127._0_4_ =
               (float)((uint)(bVar65 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar7._0_4_);
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar7._4_4_);
          bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar7._8_4_);
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar7._12_4_);
          fVar157 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar101._16_4_);
          auVar127._16_4_ = fVar157;
          fVar165 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar101._20_4_);
          auVar127._20_4_ = fVar165;
          fVar191 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar101._24_4_);
          auVar127._24_4_ = fVar191;
          auVar127._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar155),ZEXT1632(auVar80));
          auVar128._0_4_ =
               (float)((uint)(bVar65 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar8._0_4_);
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar8._4_4_);
          bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar8._8_4_);
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar8._12_4_);
          fVar79 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar101._16_4_);
          auVar128._16_4_ = fVar79;
          fVar78 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar101._20_4_);
          auVar128._20_4_ = fVar78;
          fVar164 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar101._24_4_);
          auVar128._24_4_ = fVar164;
          iVar2 = (uint)(byte)(uVar66 >> 7) * auVar101._28_4_;
          auVar128._28_4_ = iVar2;
          auVar129._0_4_ =
               (uint)(bVar65 & 1) * (int)auVar10._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar100._0_4_;
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar17 * (int)auVar10._4_4_ | (uint)!bVar17 * auVar100._4_4_;
          bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar17 * (int)auVar10._8_4_ | (uint)!bVar17 * auVar100._8_4_;
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar17 * (int)auVar10._12_4_ | (uint)!bVar17 * auVar100._12_4_;
          auVar129._16_4_ = (uint)!(bool)((byte)(uVar66 >> 4) & 1) * auVar100._16_4_;
          auVar129._20_4_ = (uint)!(bool)((byte)(uVar66 >> 5) & 1) * auVar100._20_4_;
          auVar129._24_4_ = (uint)!(bool)((byte)(uVar66 >> 6) & 1) * auVar100._24_4_;
          auVar129._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar100._28_4_;
          bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar66 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar66 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar66 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar66 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar100 = vsubps_avx512vl(auVar129,auVar93);
          auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar11._12_4_ |
                                                   (uint)!bVar21 * auVar81._12_4_,
                                                   CONCAT48((uint)bVar19 * (int)auVar11._8_4_ |
                                                            (uint)!bVar19 * auVar81._8_4_,
                                                            CONCAT44((uint)bVar17 *
                                                                     (int)auVar11._4_4_ |
                                                                     (uint)!bVar17 * auVar81._4_4_,
                                                                     (uint)(bVar65 & 1) *
                                                                     (int)auVar11._0_4_ |
                                                                     (uint)!(bool)(bVar65 & 1) *
                                                                     auVar81._0_4_)))),auVar94);
          auVar184 = ZEXT3264(auVar104);
          auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar155._12_4_ |
                                                   (uint)!bVar22 * auVar80._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar155._8_4_ |
                                                            (uint)!bVar20 * auVar80._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar155._4_4_ |
                                                                     (uint)!bVar18 * auVar80._4_4_,
                                                                     (uint)(bVar65 & 1) *
                                                                     (int)auVar155._0_4_ |
                                                                     (uint)!(bool)(bVar65 & 1) *
                                                                     auVar80._0_4_)))),auVar125);
          auVar102 = vsubps_avx(auVar93,auVar126);
          auVar186 = ZEXT3264(auVar102);
          auVar98 = vsubps_avx(auVar94,auVar127);
          auVar99 = vsubps_avx(auVar125,auVar128);
          auVar56._4_4_ = auVar103._4_4_ * fVar136;
          auVar56._0_4_ = auVar103._0_4_ * fVar134;
          auVar56._8_4_ = auVar103._8_4_ * fVar138;
          auVar56._12_4_ = auVar103._12_4_ * fVar140;
          auVar56._16_4_ = auVar103._16_4_ * 0.0;
          auVar56._20_4_ = auVar103._20_4_ * 0.0;
          auVar56._24_4_ = auVar103._24_4_ * 0.0;
          auVar56._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar56,auVar125,auVar100);
          auVar173._0_4_ = fVar135 * auVar100._0_4_;
          auVar173._4_4_ = fVar137 * auVar100._4_4_;
          auVar173._8_4_ = fVar139 * auVar100._8_4_;
          auVar173._12_4_ = fVar141 * auVar100._12_4_;
          auVar173._16_4_ = auVar100._16_4_ * 0.0;
          auVar173._20_4_ = auVar100._20_4_ * 0.0;
          auVar173._24_4_ = auVar100._24_4_ * 0.0;
          auVar173._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar173,auVar93,auVar104);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar87,ZEXT1632(auVar81));
          auVar177._0_4_ = auVar104._0_4_ * auVar125._0_4_;
          auVar177._4_4_ = auVar104._4_4_ * auVar125._4_4_;
          auVar177._8_4_ = auVar104._8_4_ * auVar125._8_4_;
          auVar177._12_4_ = auVar104._12_4_ * auVar125._12_4_;
          auVar177._16_4_ = auVar104._16_4_ * fVar190;
          auVar177._20_4_ = auVar104._20_4_ * fVar188;
          auVar177._24_4_ = auVar104._24_4_ * fVar158;
          auVar177._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar177,auVar94,auVar103);
          auVar105 = vfmadd231ps_avx512vl(auVar101,auVar87,ZEXT1632(auVar81));
          auVar101 = vmulps_avx512vl(auVar99,auVar126);
          auVar101 = vfmsub231ps_avx512vl(auVar101,auVar102,auVar128);
          auVar57._4_4_ = auVar98._4_4_ * auVar128._4_4_;
          auVar57._0_4_ = auVar98._0_4_ * auVar128._0_4_;
          auVar57._8_4_ = auVar98._8_4_ * auVar128._8_4_;
          auVar57._12_4_ = auVar98._12_4_ * auVar128._12_4_;
          auVar57._16_4_ = auVar98._16_4_ * fVar79;
          auVar57._20_4_ = auVar98._20_4_ * fVar78;
          auVar57._24_4_ = auVar98._24_4_ * fVar164;
          auVar57._28_4_ = iVar2;
          auVar81 = vfmsub231ps_fma(auVar57,auVar127,auVar99);
          auVar178._0_4_ = auVar127._0_4_ * auVar102._0_4_;
          auVar178._4_4_ = auVar127._4_4_ * auVar102._4_4_;
          auVar178._8_4_ = auVar127._8_4_ * auVar102._8_4_;
          auVar178._12_4_ = auVar127._12_4_ * auVar102._12_4_;
          auVar178._16_4_ = fVar157 * auVar102._16_4_;
          auVar178._20_4_ = fVar165 * auVar102._20_4_;
          auVar178._24_4_ = fVar191 * auVar102._24_4_;
          auVar178._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar178,auVar98,auVar126);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar87,auVar101);
          auVar108 = vfmadd231ps_avx512vl(auVar101,auVar87,ZEXT1632(auVar81));
          auVar179 = ZEXT3264(auVar108);
          auVar101 = vmaxps_avx(auVar105,auVar108);
          uVar154 = vcmpps_avx512vl(auVar101,auVar87,2);
          bVar74 = bVar74 & (byte)uVar154;
          if (bVar74 != 0) {
            auVar58._4_4_ = auVar99._4_4_ * auVar104._4_4_;
            auVar58._0_4_ = auVar99._0_4_ * auVar104._0_4_;
            auVar58._8_4_ = auVar99._8_4_ * auVar104._8_4_;
            auVar58._12_4_ = auVar99._12_4_ * auVar104._12_4_;
            auVar58._16_4_ = auVar99._16_4_ * auVar104._16_4_;
            auVar58._20_4_ = auVar99._20_4_ * auVar104._20_4_;
            auVar58._24_4_ = auVar99._24_4_ * auVar104._24_4_;
            auVar58._28_4_ = auVar101._28_4_;
            auVar6 = vfmsub231ps_fma(auVar58,auVar98,auVar103);
            auVar59._4_4_ = auVar103._4_4_ * auVar102._4_4_;
            auVar59._0_4_ = auVar103._0_4_ * auVar102._0_4_;
            auVar59._8_4_ = auVar103._8_4_ * auVar102._8_4_;
            auVar59._12_4_ = auVar103._12_4_ * auVar102._12_4_;
            auVar59._16_4_ = auVar103._16_4_ * auVar102._16_4_;
            auVar59._20_4_ = auVar103._20_4_ * auVar102._20_4_;
            auVar59._24_4_ = auVar103._24_4_ * auVar102._24_4_;
            auVar59._28_4_ = auVar103._28_4_;
            auVar82 = vfmsub231ps_fma(auVar59,auVar100,auVar99);
            auVar60._4_4_ = auVar98._4_4_ * auVar100._4_4_;
            auVar60._0_4_ = auVar98._0_4_ * auVar100._0_4_;
            auVar60._8_4_ = auVar98._8_4_ * auVar100._8_4_;
            auVar60._12_4_ = auVar98._12_4_ * auVar100._12_4_;
            auVar60._16_4_ = auVar98._16_4_ * auVar100._16_4_;
            auVar60._20_4_ = auVar98._20_4_ * auVar100._20_4_;
            auVar60._24_4_ = auVar98._24_4_ * auVar100._24_4_;
            auVar60._28_4_ = auVar98._28_4_;
            auVar7 = vfmsub231ps_fma(auVar60,auVar102,auVar104);
            auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar7));
            auVar80 = vfmadd231ps_fma(ZEXT1632(auVar81),ZEXT1632(auVar6),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar101 = vrcp14ps_avx512vl(ZEXT1632(auVar80));
            auVar103 = auVar202._0_32_;
            auVar104 = vfnmadd213ps_avx512vl(auVar101,ZEXT1632(auVar80),auVar103);
            auVar81 = vfmadd132ps_fma(auVar104,auVar101,auVar101);
            auVar184 = ZEXT1664(auVar81);
            auVar61._4_4_ = auVar7._4_4_ * auVar125._4_4_;
            auVar61._0_4_ = auVar7._0_4_ * auVar125._0_4_;
            auVar61._8_4_ = auVar7._8_4_ * auVar125._8_4_;
            auVar61._12_4_ = auVar7._12_4_ * auVar125._12_4_;
            auVar61._16_4_ = fVar190 * 0.0;
            auVar61._20_4_ = fVar188 * 0.0;
            auVar61._24_4_ = fVar158 * 0.0;
            auVar61._28_4_ = iVar1;
            auVar82 = vfmadd231ps_fma(auVar61,auVar94,ZEXT1632(auVar82));
            auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar93,ZEXT1632(auVar6));
            fVar158 = auVar81._0_4_;
            fVar188 = auVar81._4_4_;
            fVar190 = auVar81._8_4_;
            fVar191 = auVar81._12_4_;
            local_280._28_4_ = auVar101._28_4_;
            local_280._0_28_ =
                 ZEXT1628(CONCAT412(auVar82._12_4_ * fVar191,
                                    CONCAT48(auVar82._8_4_ * fVar190,
                                             CONCAT44(auVar82._4_4_ * fVar188,
                                                      auVar82._0_4_ * fVar158))));
            auVar186 = ZEXT3264(local_280);
            auVar64._4_4_ = uStack_47c;
            auVar64._0_4_ = local_480;
            auVar64._8_4_ = uStack_478;
            auVar64._12_4_ = uStack_474;
            auVar64._16_4_ = uStack_470;
            auVar64._20_4_ = uStack_46c;
            auVar64._24_4_ = uStack_468;
            auVar64._28_4_ = uStack_464;
            uVar154 = vcmpps_avx512vl(local_280,auVar64,0xd);
            uVar153 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar29._4_4_ = uVar153;
            auVar29._0_4_ = uVar153;
            auVar29._8_4_ = uVar153;
            auVar29._12_4_ = uVar153;
            auVar29._16_4_ = uVar153;
            auVar29._20_4_ = uVar153;
            auVar29._24_4_ = uVar153;
            auVar29._28_4_ = uVar153;
            uVar23 = vcmpps_avx512vl(local_280,auVar29,2);
            bVar74 = (byte)uVar154 & (byte)uVar23 & bVar74;
            if (bVar74 != 0) {
              uVar75 = vcmpps_avx512vl(ZEXT1632(auVar80),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar75 = bVar74 & uVar75;
              if ((char)uVar75 != '\0') {
                fVar165 = auVar105._0_4_ * fVar158;
                fVar157 = auVar105._4_4_ * fVar188;
                auVar62._4_4_ = fVar157;
                auVar62._0_4_ = fVar165;
                fVar164 = auVar105._8_4_ * fVar190;
                auVar62._8_4_ = fVar164;
                fVar78 = auVar105._12_4_ * fVar191;
                auVar62._12_4_ = fVar78;
                fVar79 = auVar105._16_4_ * 0.0;
                auVar62._16_4_ = fVar79;
                fVar134 = auVar105._20_4_ * 0.0;
                auVar62._20_4_ = fVar134;
                fVar135 = auVar105._24_4_ * 0.0;
                auVar62._24_4_ = fVar135;
                auVar62._28_4_ = auVar105._28_4_;
                auVar101 = vsubps_avx512vl(auVar103,auVar62);
                local_2c0._0_4_ =
                     (float)((uint)(bVar65 & 1) * (int)fVar165 |
                            (uint)!(bool)(bVar65 & 1) * auVar101._0_4_);
                bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar17 * (int)fVar157 | (uint)!bVar17 * auVar101._4_4_);
                bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar17 * (int)fVar164 | (uint)!bVar17 * auVar101._8_4_);
                bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar17 * (int)fVar78 | (uint)!bVar17 * auVar101._12_4_);
                bVar17 = (bool)((byte)(uVar66 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar17 * (int)fVar79 | (uint)!bVar17 * auVar101._16_4_);
                bVar17 = (bool)((byte)(uVar66 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar17 * (int)fVar134 | (uint)!bVar17 * auVar101._20_4_);
                bVar17 = (bool)((byte)(uVar66 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar17 * (int)fVar135 | (uint)!bVar17 * auVar101._24_4_);
                bVar17 = SUB81(uVar66 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar17 * auVar105._28_4_ | (uint)!bVar17 * auVar101._28_4_);
                auVar101 = vsubps_avx(auVar107,auVar106);
                auVar81 = vfmadd213ps_fma(auVar101,local_2c0,auVar106);
                uVar153 = *(undefined4 *)((long)local_540->ray_space + k * 4 + -0x10);
                auVar30._4_4_ = uVar153;
                auVar30._0_4_ = uVar153;
                auVar30._8_4_ = uVar153;
                auVar30._12_4_ = uVar153;
                auVar30._16_4_ = uVar153;
                auVar30._20_4_ = uVar153;
                auVar30._24_4_ = uVar153;
                auVar30._28_4_ = uVar153;
                auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                              CONCAT48(auVar81._8_4_ + auVar81._8_4_
                                                                       ,CONCAT44(auVar81._4_4_ +
                                                                                 auVar81._4_4_,
                                                                                 auVar81._0_4_ +
                                                                                 auVar81._0_4_)))),
                                           auVar30);
                uVar77 = vcmpps_avx512vl(local_280,auVar101,6);
                uVar75 = uVar75 & uVar77;
                bVar74 = (byte)uVar75;
                if (bVar74 != 0) {
                  auVar156._0_4_ = auVar108._0_4_ * fVar158;
                  auVar156._4_4_ = auVar108._4_4_ * fVar188;
                  auVar156._8_4_ = auVar108._8_4_ * fVar190;
                  auVar156._12_4_ = auVar108._12_4_ * fVar191;
                  auVar156._16_4_ = auVar108._16_4_ * 0.0;
                  auVar156._20_4_ = auVar108._20_4_ * 0.0;
                  auVar156._24_4_ = auVar108._24_4_ * 0.0;
                  auVar156._28_4_ = 0;
                  auVar101 = vsubps_avx512vl(auVar103,auVar156);
                  auVar130._0_4_ =
                       (uint)(bVar65 & 1) * (int)auVar156._0_4_ |
                       (uint)!(bool)(bVar65 & 1) * auVar101._0_4_;
                  bVar17 = (bool)((byte)(uVar66 >> 1) & 1);
                  auVar130._4_4_ =
                       (uint)bVar17 * (int)auVar156._4_4_ | (uint)!bVar17 * auVar101._4_4_;
                  bVar17 = (bool)((byte)(uVar66 >> 2) & 1);
                  auVar130._8_4_ =
                       (uint)bVar17 * (int)auVar156._8_4_ | (uint)!bVar17 * auVar101._8_4_;
                  bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
                  auVar130._12_4_ =
                       (uint)bVar17 * (int)auVar156._12_4_ | (uint)!bVar17 * auVar101._12_4_;
                  bVar17 = (bool)((byte)(uVar66 >> 4) & 1);
                  auVar130._16_4_ =
                       (uint)bVar17 * (int)auVar156._16_4_ | (uint)!bVar17 * auVar101._16_4_;
                  bVar17 = (bool)((byte)(uVar66 >> 5) & 1);
                  auVar130._20_4_ =
                       (uint)bVar17 * (int)auVar156._20_4_ | (uint)!bVar17 * auVar101._20_4_;
                  bVar17 = (bool)((byte)(uVar66 >> 6) & 1);
                  auVar130._24_4_ =
                       (uint)bVar17 * (int)auVar156._24_4_ | (uint)!bVar17 * auVar101._24_4_;
                  auVar130._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar101._28_4_;
                  auVar31._8_4_ = 0x40000000;
                  auVar31._0_8_ = 0x4000000040000000;
                  auVar31._12_4_ = 0x40000000;
                  auVar31._16_4_ = 0x40000000;
                  auVar31._20_4_ = 0x40000000;
                  auVar31._24_4_ = 0x40000000;
                  auVar31._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar130,auVar103,auVar31);
                  local_260 = (int)lVar69;
                  local_25c = iVar12;
                  local_250 = local_5a0._0_8_;
                  uStack_248 = local_5a0._8_8_;
                  local_240 = local_5b0._0_8_;
                  uStack_238 = local_5b0._8_8_;
                  local_230 = local_5c0._0_8_;
                  uStack_228 = local_5c0._8_8_;
                  local_220 = local_5d0;
                  uStack_218 = uStack_5c8;
                  pGVar71 = (context->scene->geometries).items[local_5d8].ptr;
                  if ((pGVar71->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    uVar73 = (uint)uVar75;
                    auVar81 = vcvtsi2ss_avx512f(auVar86,(int)lVar69);
                    fVar158 = auVar81._0_4_;
                    local_200[0] = (fVar158 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar158 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar158 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar158 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar158 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar158 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar158 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar158 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar148._8_4_ = 0x7f800000;
                    auVar148._0_8_ = 0x7f8000007f800000;
                    auVar148._12_4_ = 0x7f800000;
                    auVar148._16_4_ = 0x7f800000;
                    auVar148._20_4_ = 0x7f800000;
                    auVar148._24_4_ = 0x7f800000;
                    auVar148._28_4_ = 0x7f800000;
                    auVar101 = vblendmps_avx512vl(auVar148,local_280);
                    auVar131._0_4_ =
                         (uint)(bVar74 & 1) * auVar101._0_4_ |
                         (uint)!(bool)(bVar74 & 1) * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar75 >> 1) & 1);
                    auVar131._4_4_ = (uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar75 >> 2) & 1);
                    auVar131._8_4_ = (uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar75 >> 3) & 1);
                    auVar131._12_4_ = (uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar75 >> 4) & 1);
                    auVar131._16_4_ = (uint)bVar17 * auVar101._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
                    auVar131._20_4_ = (uint)bVar17 * auVar101._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar75 >> 6) & 1);
                    auVar131._24_4_ = (uint)bVar17 * auVar101._24_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = SUB81(uVar75 >> 7,0);
                    auVar131._28_4_ = (uint)bVar17 * auVar101._28_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar101 = vshufps_avx(auVar131,auVar131,0xb1);
                    auVar101 = vminps_avx(auVar131,auVar101);
                    auVar104 = vshufpd_avx(auVar101,auVar101,5);
                    auVar101 = vminps_avx(auVar101,auVar104);
                    auVar104 = vpermpd_avx2(auVar101,0x4e);
                    auVar101 = vminps_avx(auVar101,auVar104);
                    uVar154 = vcmpps_avx512vl(auVar131,auVar101,0);
                    if ((bVar74 & (byte)uVar154) != 0) {
                      uVar73 = (uint)(bVar74 & (byte)uVar154);
                    }
                    uVar68 = 0;
                    for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                      uVar68 = uVar68 + 1;
                    }
                    uVar66 = (ulong)uVar68;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar71->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_560 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      local_548 = pGVar71;
                      local_538 = uVar76;
                      local_520 = local_280;
                      do {
                        local_420 = local_200[uVar66];
                        local_410 = *(undefined4 *)(local_1e0 + uVar66 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + uVar66 * 4);
                        local_590.context = context->user;
                        fVar188 = 1.0 - local_420;
                        fVar158 = fVar188 * fVar188 * -3.0;
                        auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar188 * fVar188)),
                                                  ZEXT416((uint)(local_420 * fVar188)),
                                                  ZEXT416(0xc0000000));
                        auVar80 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar188)),
                                                  ZEXT416((uint)(local_420 * local_420)),
                                                  ZEXT416(0x40000000));
                        fVar188 = auVar81._0_4_ * 3.0;
                        fVar190 = auVar80._0_4_ * 3.0;
                        fVar191 = local_420 * local_420 * 3.0;
                        auVar182._0_4_ = fVar191 * (float)local_5d0._0_4_;
                        auVar182._4_4_ = fVar191 * (float)local_5d0._4_4_;
                        auVar182._8_4_ = fVar191 * (float)uStack_5c8;
                        auVar182._12_4_ = fVar191 * uStack_5c8._4_4_;
                        auVar184 = ZEXT1664(auVar182);
                        auVar142._4_4_ = fVar190;
                        auVar142._0_4_ = fVar190;
                        auVar142._8_4_ = fVar190;
                        auVar142._12_4_ = fVar190;
                        auVar81 = vfmadd132ps_fma(auVar142,auVar182,local_5c0);
                        auVar171._4_4_ = fVar188;
                        auVar171._0_4_ = fVar188;
                        auVar171._8_4_ = fVar188;
                        auVar171._12_4_ = fVar188;
                        auVar81 = vfmadd132ps_fma(auVar171,auVar81,local_5b0);
                        auVar143._4_4_ = fVar158;
                        auVar143._0_4_ = fVar158;
                        auVar143._8_4_ = fVar158;
                        auVar143._12_4_ = fVar158;
                        auVar81 = vfmadd132ps_fma(auVar143,auVar81,local_5a0);
                        local_450 = auVar81._0_4_;
                        local_440 = vshufps_avx(auVar81,auVar81,0x55);
                        auVar179 = ZEXT1664(local_440);
                        local_430 = vshufps_avx(auVar81,auVar81,0xaa);
                        iStack_44c = local_450;
                        iStack_448 = local_450;
                        iStack_444 = local_450;
                        fStack_41c = local_420;
                        fStack_418 = local_420;
                        fStack_414 = local_420;
                        uStack_40c = local_410;
                        uStack_408 = local_410;
                        uStack_404 = local_410;
                        local_400 = local_4e0._0_8_;
                        uStack_3f8 = local_4e0._8_8_;
                        local_3f0 = local_4d0;
                        vpcmpeqd_avx2(ZEXT1632(local_4d0),ZEXT1632(local_4d0));
                        uStack_3dc = (local_590.context)->instID[0];
                        local_3e0 = uStack_3dc;
                        uStack_3d8 = uStack_3dc;
                        uStack_3d4 = uStack_3dc;
                        uStack_3d0 = (local_590.context)->instPrimID[0];
                        uStack_3cc = uStack_3d0;
                        uStack_3c8 = uStack_3d0;
                        uStack_3c4 = uStack_3d0;
                        local_5f0 = local_4f0;
                        local_590.valid = (int *)local_5f0;
                        local_590.geometryUserPtr = pGVar71->userPtr;
                        local_590.hit = (RTCHitN *)&local_450;
                        local_590.N = 4;
                        local_590.ray = (RTCRayN *)ray;
                        if (pGVar71->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar179 = ZEXT1664(local_440);
                          auVar184 = ZEXT1664(auVar182);
                          (*pGVar71->intersectionFilterN)(&local_590);
                          auVar186 = ZEXT3264(local_520);
                          pGVar71 = local_548;
                        }
                        uVar76 = vptestmd_avx512vl(local_5f0,local_5f0);
                        if ((uVar76 & 0xf) == 0) {
LAB_01b03d28:
                          *(undefined4 *)(ray + k * 4 + 0x80) = local_560._0_4_;
                        }
                        else {
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar71->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar179 = ZEXT1664(auVar179._0_16_);
                            auVar184 = ZEXT1664(auVar184._0_16_);
                            (*p_Var16)(&local_590);
                            auVar186 = ZEXT3264(local_520);
                            pGVar71 = local_548;
                          }
                          uVar76 = vptestmd_avx512vl(local_5f0,local_5f0);
                          uVar76 = uVar76 & 0xf;
                          bVar74 = (byte)uVar76;
                          if (bVar74 == 0) goto LAB_01b03d28;
                          iVar1 = *(int *)(local_590.hit + 4);
                          iVar2 = *(int *)(local_590.hit + 8);
                          iVar63 = *(int *)(local_590.hit + 0xc);
                          bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
                          bVar19 = SUB81(uVar76 >> 3,0);
                          *(uint *)(local_590.ray + 0xc0) =
                               (uint)(bVar74 & 1) * *(int *)local_590.hit |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xc0);
                          *(uint *)(local_590.ray + 0xc4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xc4)
                          ;
                          *(uint *)(local_590.ray + 200) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 200);
                          *(uint *)(local_590.ray + 0xcc) =
                               (uint)bVar19 * iVar63 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xcc);
                          iVar1 = *(int *)(local_590.hit + 0x14);
                          iVar2 = *(int *)(local_590.hit + 0x18);
                          iVar63 = *(int *)(local_590.hit + 0x1c);
                          bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
                          bVar19 = SUB81(uVar76 >> 3,0);
                          *(uint *)(local_590.ray + 0xd0) =
                               (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x10) |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xd0);
                          *(uint *)(local_590.ray + 0xd4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xd4)
                          ;
                          *(uint *)(local_590.ray + 0xd8) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xd8)
                          ;
                          *(uint *)(local_590.ray + 0xdc) =
                               (uint)bVar19 * iVar63 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xdc);
                          iVar1 = *(int *)(local_590.hit + 0x24);
                          iVar2 = *(int *)(local_590.hit + 0x28);
                          iVar63 = *(int *)(local_590.hit + 0x2c);
                          bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
                          bVar19 = SUB81(uVar76 >> 3,0);
                          *(uint *)(local_590.ray + 0xe0) =
                               (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x20) |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xe0);
                          *(uint *)(local_590.ray + 0xe4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xe4)
                          ;
                          *(uint *)(local_590.ray + 0xe8) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xe8)
                          ;
                          *(uint *)(local_590.ray + 0xec) =
                               (uint)bVar19 * iVar63 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xec);
                          iVar1 = *(int *)(local_590.hit + 0x34);
                          iVar2 = *(int *)(local_590.hit + 0x38);
                          iVar63 = *(int *)(local_590.hit + 0x3c);
                          bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
                          bVar19 = SUB81(uVar76 >> 3,0);
                          *(uint *)(local_590.ray + 0xf0) =
                               (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x30) |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xf0);
                          *(uint *)(local_590.ray + 0xf4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xf4)
                          ;
                          *(uint *)(local_590.ray + 0xf8) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xf8)
                          ;
                          *(uint *)(local_590.ray + 0xfc) =
                               (uint)bVar19 * iVar63 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xfc);
                          iVar1 = *(int *)(local_590.hit + 0x44);
                          iVar2 = *(int *)(local_590.hit + 0x48);
                          iVar63 = *(int *)(local_590.hit + 0x4c);
                          bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
                          bVar19 = SUB81(uVar76 >> 3,0);
                          *(uint *)(local_590.ray + 0x100) =
                               (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x40) |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0x100);
                          *(uint *)(local_590.ray + 0x104) =
                               (uint)bVar17 * iVar1 |
                               (uint)!bVar17 * *(int *)(local_590.ray + 0x104);
                          *(uint *)(local_590.ray + 0x108) =
                               (uint)bVar18 * iVar2 |
                               (uint)!bVar18 * *(int *)(local_590.ray + 0x108);
                          *(uint *)(local_590.ray + 0x10c) =
                               (uint)bVar19 * iVar63 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0x10c);
                          auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar81;
                          auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar81;
                          auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar81;
                          auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar81;
                          local_560._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                          local_560._4_4_ = 0;
                          local_560._8_4_ = 0;
                          local_560._12_4_ = 0;
                        }
                        bVar74 = ~(byte)(1 << ((uint)uVar66 & 0x1f)) & (byte)uVar75;
                        auVar149._4_4_ = local_560._0_4_;
                        auVar149._0_4_ = local_560._0_4_;
                        auVar149._8_4_ = local_560._0_4_;
                        auVar149._12_4_ = local_560._0_4_;
                        auVar149._16_4_ = local_560._0_4_;
                        auVar149._20_4_ = local_560._0_4_;
                        auVar149._24_4_ = local_560._0_4_;
                        auVar149._28_4_ = local_560._0_4_;
                        uVar154 = vcmpps_avx512vl(auVar186._0_32_,auVar149,2);
                        if ((bVar74 & (byte)uVar154) == 0) goto LAB_01b03dc7;
                        bVar74 = bVar74 & (byte)uVar154;
                        uVar73 = (uint)bVar74;
                        uVar75 = (ulong)uVar73;
                        auVar150._8_4_ = 0x7f800000;
                        auVar150._0_8_ = 0x7f8000007f800000;
                        auVar150._12_4_ = 0x7f800000;
                        auVar150._16_4_ = 0x7f800000;
                        auVar150._20_4_ = 0x7f800000;
                        auVar150._24_4_ = 0x7f800000;
                        auVar150._28_4_ = 0x7f800000;
                        auVar101 = vblendmps_avx512vl(auVar150,auVar186._0_32_);
                        auVar132._0_4_ =
                             (uint)(bVar74 & 1) * auVar101._0_4_ |
                             (uint)!(bool)(bVar74 & 1) * 0x7f800000;
                        bVar17 = (bool)(bVar74 >> 1 & 1);
                        auVar132._4_4_ = (uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar74 >> 2 & 1);
                        auVar132._8_4_ = (uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar74 >> 3 & 1);
                        auVar132._12_4_ =
                             (uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar74 >> 4 & 1);
                        auVar132._16_4_ =
                             (uint)bVar17 * auVar101._16_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar74 >> 5 & 1);
                        auVar132._20_4_ =
                             (uint)bVar17 * auVar101._20_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar74 >> 6 & 1);
                        auVar132._24_4_ =
                             (uint)bVar17 * auVar101._24_4_ | (uint)!bVar17 * 0x7f800000;
                        auVar132._28_4_ =
                             (uint)(bVar74 >> 7) * auVar101._28_4_ |
                             (uint)!(bool)(bVar74 >> 7) * 0x7f800000;
                        auVar101 = vshufps_avx(auVar132,auVar132,0xb1);
                        auVar101 = vminps_avx(auVar132,auVar101);
                        auVar104 = vshufpd_avx(auVar101,auVar101,5);
                        auVar101 = vminps_avx(auVar101,auVar104);
                        auVar104 = vpermpd_avx2(auVar101,0x4e);
                        auVar101 = vminps_avx(auVar101,auVar104);
                        uVar154 = vcmpps_avx512vl(auVar132,auVar101,0);
                        bVar74 = (byte)uVar154 & bVar74;
                        if (bVar74 != 0) {
                          uVar73 = (uint)bVar74;
                        }
                        uVar68 = 0;
                        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                          uVar68 = uVar68 + 1;
                        }
                        uVar66 = (ulong)uVar68;
                      } while( true );
                    }
                    fVar158 = local_200[uVar66];
                    uVar153 = *(undefined4 *)(local_1e0 + uVar66 * 4);
                    fVar190 = 1.0 - fVar158;
                    fVar188 = fVar190 * fVar190 * -3.0;
                    auVar179 = ZEXT464((uint)fVar188);
                    auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),
                                              ZEXT416((uint)(fVar158 * fVar190)),ZEXT416(0xc0000000)
                                             );
                    auVar80 = vfmsub132ss_fma(ZEXT416((uint)(fVar158 * fVar190)),
                                              ZEXT416((uint)(fVar158 * fVar158)),ZEXT416(0x40000000)
                                             );
                    fVar190 = auVar81._0_4_ * 3.0;
                    fVar191 = auVar80._0_4_ * 3.0;
                    fVar165 = fVar158 * fVar158 * 3.0;
                    auVar181._0_4_ = fVar165 * (float)local_5d0._0_4_;
                    auVar181._4_4_ = fVar165 * (float)local_5d0._4_4_;
                    auVar181._8_4_ = fVar165 * (float)uStack_5c8;
                    auVar181._12_4_ = fVar165 * uStack_5c8._4_4_;
                    auVar184 = ZEXT1664(auVar181);
                    auVar161._4_4_ = fVar191;
                    auVar161._0_4_ = fVar191;
                    auVar161._8_4_ = fVar191;
                    auVar161._12_4_ = fVar191;
                    auVar81 = vfmadd132ps_fma(auVar161,auVar181,local_5c0);
                    auVar170._4_4_ = fVar190;
                    auVar170._0_4_ = fVar190;
                    auVar170._8_4_ = fVar190;
                    auVar170._12_4_ = fVar190;
                    auVar81 = vfmadd132ps_fma(auVar170,auVar81,local_5b0);
                    auVar162._4_4_ = fVar188;
                    auVar162._0_4_ = fVar188;
                    auVar162._8_4_ = fVar188;
                    auVar162._12_4_ = fVar188;
                    auVar81 = vfmadd132ps_fma(auVar162,auVar81,local_5a0);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar66 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar81._0_4_;
                    uVar13 = vextractps_avx(auVar81,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                    uVar13 = vextractps_avx(auVar81,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar13;
                    *(float *)(ray + k * 4 + 0xf0) = fVar158;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar153;
                    *(int *)(ray + k * 4 + 0x110) = (int)uVar76;
                    *(int *)(ray + k * 4 + 0x120) = (int)local_5d8;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01b03a3e;
      }
    }
    uVar153 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar28._4_4_ = uVar153;
    auVar28._0_4_ = uVar153;
    auVar28._8_4_ = uVar153;
    auVar28._12_4_ = uVar153;
    auVar28._16_4_ = uVar153;
    auVar28._20_4_ = uVar153;
    auVar28._24_4_ = uVar153;
    auVar28._28_4_ = uVar153;
    uVar154 = vcmpps_avx512vl(local_80,auVar28,2);
    local_528 = (ulong)((uint)local_528 & (uint)local_528 + 0xff & (uint)uVar154);
  } while( true );
LAB_01b03dc7:
  auVar101 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar201 = ZEXT3264(auVar101);
  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar202 = ZEXT3264(auVar101);
  auVar203 = ZEXT464(0xbf800000);
  prim = local_5e0;
  uVar76 = local_538;
LAB_01b03a3e:
  lVar69 = lVar69 + 8;
  goto LAB_01b03189;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }